

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O1

void SPARSITY_PREPROC_CSR(int *colVals,int *rowPtrs,int *consP,int NCELLS,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  int k_1;
  long lVar36;
  undefined1 (*pauVar37) [16];
  double *pdVar38;
  int iVar39;
  double *pdVar40;
  double *pdVar41;
  long lVar42;
  ulong uVar43;
  int k;
  int iVar44;
  double *pdVar45;
  int iVar46;
  double *pdVar47;
  double *pdVar48;
  double *pdVar49;
  double *pdVar50;
  double *__s;
  double *pdVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  undefined1 auVar122 [16];
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  undefined4 uVar192;
  undefined4 uVar193;
  undefined4 uVar194;
  undefined4 uVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  undefined4 uVar270;
  undefined4 uVar271;
  undefined4 uVar272;
  undefined4 uVar273;
  undefined4 uVar274;
  undefined4 uVar275;
  undefined4 uVar276;
  undefined4 uVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  double dVar325;
  double dVar326;
  double dVar327;
  GpuArray<double,_21U> conc;
  Real h_RT [21];
  GpuArray<double,_484U> Jac;
  Real c_R [21];
  Real dcRdT [21];
  double adStack_1490 [33];
  undefined1 local_1388 [16];
  double local_1378;
  double dStack_1370;
  double dStack_1368;
  double local_1360;
  double dStack_1358;
  double dStack_1350;
  double local_1348;
  double local_1328;
  double local_1320;
  double local_1318;
  double local_1310;
  double local_1308;
  double local_1300;
  double local_12f8;
  double dStack_12f0;
  double local_12e8;
  double dStack_12e0;
  double local_12d8;
  double dStack_12d0;
  double local_12c8;
  double dStack_12c0;
  double local_12b8;
  double dStack_12b0;
  double local_12a8;
  double dStack_12a0;
  double local_1298;
  double dStack_1290;
  double local_1288;
  double dStack_1280;
  double local_1278;
  double dStack_1270;
  double local_1268;
  double dStack_1260;
  double local_1258;
  double local_1248 [4];
  undefined1 auStack_1228 [16];
  double local_1218;
  double dStack_1210;
  double local_1208;
  double dStack_1200;
  double local_11f8;
  double dStack_11f0;
  double dStack_11e8;
  double local_11e0;
  double dStack_11d8;
  double dStack_11d0;
  double dStack_11c8;
  double dStack_11c0;
  double local_11b8;
  double local_11b0;
  double local_11a8;
  double local_11a0;
  double local_1198;
  double local_1190;
  double dStack_1188;
  double local_1180;
  double local_1178;
  double local_1170;
  double local_1168;
  double local_1160;
  double local_1158;
  double local_1150;
  double local_1148;
  double local_1140;
  double local_1138;
  double local_1130;
  double local_1128;
  double local_1120;
  double local_1118;
  double local_1110;
  double local_1108 [3];
  double adStack_10f0 [200];
  undefined1 local_ab0 [16];
  double local_aa0;
  double local_a98;
  double local_a90;
  double local_a88;
  double local_a80;
  double local_a78;
  double local_a70;
  double local_a68;
  double dStack_a60;
  double local_a58;
  double local_a50;
  double local_a48;
  double local_a40;
  double local_a38;
  double local_a30;
  double local_a28;
  double local_a08;
  double local_a00;
  double dStack_9f8;
  double local_9f0;
  double local_9e8;
  double local_9e0;
  double local_9d8;
  double local_9d0;
  double local_9c8;
  double local_9c0;
  double local_9b8;
  double dStack_9b0;
  double local_9a8;
  double local_9a0;
  double local_998;
  double local_990;
  double local_988;
  double local_980;
  double local_978;
  double local_958;
  undefined1 local_950 [16];
  double local_940;
  double local_938;
  double local_928;
  double local_920;
  double local_918;
  double local_910;
  double local_908;
  double local_900;
  double local_8f8;
  double local_8f0;
  double local_8e8;
  double local_8e0;
  double local_8d8;
  double local_8d0;
  double local_8c8;
  double local_8a8;
  double local_8a0;
  double local_898;
  double local_890;
  double local_888;
  double local_880;
  double local_878;
  double local_870;
  double local_868;
  double local_860;
  double local_858;
  double dStack_850;
  double local_848;
  double local_840;
  double local_838;
  double local_828;
  double local_7f8;
  double local_7f0;
  double local_7e8;
  double local_7e0;
  double local_7d8;
  double local_7d0;
  double local_7c8;
  double dStack_7c0;
  double local_7b8;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  double local_798;
  double local_790;
  double local_788;
  double local_780;
  double local_770;
  double local_740;
  double local_738;
  double local_730;
  double local_728;
  double local_718;
  double local_700;
  double local_6d8;
  double local_6d0;
  double local_690;
  double local_688;
  double local_680;
  double local_668;
  double local_660;
  double local_658;
  double dStack_650;
  double local_630;
  double local_618;
  double local_610;
  double local_5e8;
  double local_5e0;
  double local_5d8;
  double local_5d0;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_5a0;
  double local_598;
  double local_578;
  double local_568;
  double local_560;
  double local_558;
  double local_538;
  double local_530;
  double dStack_528;
  double local_520;
  double local_518;
  double local_510;
  double local_508;
  double local_500;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_480;
  double local_470;
  double local_458;
  double local_450;
  double local_448;
  double local_3d8;
  double local_3d0;
  double dStack_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  double local_388;
  double local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_358;
  double local_350;
  double local_348;
  double local_328 [21];
  double local_280;
  uint local_274;
  double local_270;
  int local_264;
  double *local_260;
  double *local_258;
  double *local_250;
  double *local_248;
  double local_240;
  double local_238 [22];
  double local_188 [22];
  double local_d8;
  double local_d0 [2];
  double local_c0 [2];
  double local_b0 [2];
  double local_a0 [2];
  double local_90 [2];
  double local_80 [2];
  double local_70 [2];
  double local_60 [2];
  double adStack_50 [2];
  double adStack_40 [2];
  
  adStack_1490[0] = 7.22653021940033e-318;
  local_274 = NCELLS;
  local_264 = base;
  memset(&local_1198,0,0xf20);
  adStack_1490[0] = 7.2266043292472e-318;
  memset(adStack_1490 + 1,0,0xa8);
  pdVar48 = &local_d8;
  local_258 = adStack_50;
  local_248 = local_188 + 0x11;
  local_250 = local_188 + 0x13;
  local_260 = adStack_40;
  lVar36 = 1;
  auVar122 = _DAT_0077bb30;
  do {
    if (SUB164(auVar122 ^ _DAT_0077bb40,4) == -0x80000000 &&
        SUB164(auVar122 ^ _DAT_0077bb40,0) < -0x7fffffeb) {
      adStack_1490[lVar36] = 0.047619047619047616;
      adStack_1490[lVar36 + 1] = 0.047619047619047616;
    }
    lVar42 = auVar122._8_8_;
    auVar122._0_8_ = auVar122._0_8_ + 2;
    auVar122._8_8_ = lVar42 + 2;
    lVar36 = lVar36 + 2;
  } while (lVar36 != 0x17);
  iVar39 = *consP;
  __s = &local_1198;
  lVar36 = 0;
  adStack_1490[0] = 7.22770609563743e-318;
  memset(__s,0,0xf20);
  adStack_1490[0] = 7.2278049087666e-318;
  memset(adStack_1490 + 0x17,0,0xa8);
  local_11a0 = 0.0;
  do {
    local_11a0 = local_11a0 + adStack_1490[lVar36 + 1];
    lVar36 = lVar36 + 1;
  } while (lVar36 != 0x15);
  local_12f8 = 2.9101473600491667;
  dStack_12f0 = 19.482439934646393;
  local_12e8 = 22.00757879476429;
  dStack_12e0 = 3.2555381179699996;
  local_12d8 = 6.1092103122075;
  dStack_12d0 = -15.524086927680834;
  local_12c8 = 5.3818731557687505;
  dStack_12c0 = 35.602608086557915;
  local_12b8 = 38.543891960460414;
  dStack_12b0 = 17.114317783399166;
  local_12a8 = 0.4349435637083328;
  dStack_12a0 = -5.748131844745;
  local_1298 = -26.605086887896665;
  dStack_1290 = 7.7442483232375;
  local_1288 = -3.2271354189666677;
  dStack_1280 = 8.078776559375;
  local_1278 = 12.395261584404166;
  dStack_1270 = 18.914627724425003;
  local_1268 = 3.874817692333335;
  dStack_1260 = 3.0794231235708334;
  local_1258 = 2.0030833333333335;
  local_1300 = adStack_1490[0x15] * -0.30000000000000004 +
               adStack_1490[0x13] + adStack_1490[0x13] +
               adStack_1490[0xc] * 0.5 +
               adStack_1490[6] * 5.0 + adStack_1490[1] + local_11a0 + adStack_1490[0xb] +
               adStack_1490[0xd];
  local_1310 = adStack_1490[2] * adStack_1490[8];
  dVar52 = ((local_1300 * 1e-12) / 71955998.06277587) * 2.2543283025642333e+17;
  local_1308 = dVar52 + 1.0;
  local_1318 = dVar52 / local_1308;
  local_1320 = -0.0005580285508678667 / local_1308;
  adStack_1490[0] = 7.2298602218533e-318;
  dVar52 = log10(dVar52);
  local_1328 = 1.0 / ((dVar52 + -0.09006792635084097) * -0.14 + 1.3374831843797492);
  local_270 = (dVar52 + -0.09006792635084097) * local_1328;
  local_240 = 1.0 / (local_270 * local_270 + 1.0);
  adStack_1490[0] = 7.23045310062831e-318;
  dVar53 = pow(10.0,local_240 * -0.46258518455098363);
  dVar168 = local_240 * -0.9251703691019673 * local_240 * local_270 * local_1328;
  dVar169 = dVar168 * -1.3374831843797492 * local_1328;
  dVar53 = dVar53 * local_1318;
  dVar52 = (local_1310 * 71955998.06277587 + adStack_1490[10] * -0.15021418125880825) * dVar53;
  dVar168 = (local_1310 * -38376.53230014713 +
            (((dStack_12b0 - (dStack_12f0 + dStack_12c0)) + 1.0) * -0.0006666666666666666 +
            -0.0005333333333333334) * -0.15021418125880825 * adStack_1490[10]) * dVar53 +
            ((local_270 * dVar168 * -1.27 + dVar169 * -0.67 + local_240) * -0.0001271297967317221 +
             dVar169 * -0.0005580285508678667 + local_1320) * 2.302585092994046 * dVar52;
  adStack_1490[0x18] = adStack_1490[0x18] - dVar52;
  adStack_1490[0x1e] = adStack_1490[0x1e] - dVar52;
  adStack_1490[0x20] = adStack_1490[0x20] + dVar52;
  dVar209 = dVar53 * 71955998.06277587;
  dVar53 = dVar53 * 0.15021418125880825;
  dVar52 = (1.0 / local_1308 + dVar169) * (dVar52 / local_1300);
  if (iVar39 == 0) {
    local_1248[0] = dVar52 * 2.0;
    local_1248[1] = adStack_1490[8] * dVar209 + dVar52;
    local_1248[2] = dVar52;
    local_1248[3] = dVar52;
    auStack_1228._8_8_ = dVar52 * 6.0;
    auStack_1228._0_8_ = dVar52;
    local_1218 = dVar52;
    dStack_1210 = dVar209 * adStack_1490[2] + dVar52;
    local_1208 = dVar52;
    dStack_1200 = dVar52 - dVar53;
    auVar20._8_4_ = SUB84(dVar52 * 1.5,0);
    auVar20._0_8_ = local_1248[0];
    auVar20._12_4_ = (int)((ulong)(dVar52 * 1.5) >> 0x20);
    local_11f8 = local_1248[0];
    dStack_11f0 = auVar20._8_8_;
    dStack_11e8 = local_1248[0];
    dStack_11d0 = dVar52;
    dStack_11c8 = dVar52;
    local_11e0 = dVar52;
    dStack_11d8 = dVar52;
    dStack_11c0 = dVar52;
    local_11b8 = dVar52 * 3.0;
    local_11b0 = dVar52;
    local_11a8 = dVar52 * 0.7;
    pdVar38 = &local_1150;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-8] = pdVar38[-8] - dVar52;
      pdVar38[-2] = pdVar38[-2] - dVar52;
      *pdVar38 = dVar52 + *pdVar38;
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    local_1190 = local_1190 - dVar52;
    local_1160 = local_1160 - dVar52;
    local_1150 = local_1150 + dVar52;
    dVar169 = adStack_1490[8] * dVar209;
    adStack_10f0[2] = adStack_10f0[2] - dVar169;
    adStack_10f0[8] = adStack_10f0[8] - dVar169;
    adStack_10f0[10] = dVar169 + adStack_10f0[10];
    dVar169 = dVar52 * 5.0;
    adStack_10f0[0x5a] = adStack_10f0[0x5a] - dVar169;
    adStack_10f0[0x60] = adStack_10f0[0x60] - dVar169;
    adStack_10f0[0x62] = dVar169 + adStack_10f0[0x62];
    dVar209 = dVar209 * adStack_1490[2];
    adStack_10f0[0x86] = adStack_10f0[0x86] - dVar209;
    adStack_10f0[0x8c] = adStack_10f0[0x8c] - dVar209;
    adStack_10f0[0x8e] = dVar209 + adStack_10f0[0x8e];
    adStack_10f0[0xb2] = adStack_10f0[0xb2] + dVar53;
    adStack_10f0[0xb8] = adStack_10f0[0xb8] + dVar53;
    adStack_10f0[0xba] = adStack_10f0[0xba] - dVar53;
    local_ab0._0_8_ = (double)local_ab0._0_8_ - dVar52;
    local_a80 = local_a80 - dVar52;
    local_a70 = local_a70 + dVar52;
    dVar53 = dVar52 * 0.5;
    local_a00 = local_a00 - dVar53;
    local_9d0 = local_9d0 - dVar53;
    local_9c0 = dVar53 + local_9c0;
    local_950._0_8_ = (double)local_950._0_8_ - dVar52;
    local_920 = local_920 - dVar52;
    local_910 = local_910 + dVar52;
    dVar53 = dVar52 + dVar52;
    local_530 = local_530 - dVar53;
    local_500 = local_500 - dVar53;
    local_4f0 = dVar53 + local_4f0;
    dVar52 = dVar52 * -0.30000000000000004;
    local_3d0 = local_3d0 - dVar52;
    local_3a0 = local_3a0 - dVar52;
    local_390 = dVar52 + local_390;
  }
  local_328[1] = local_328[1] - dVar168;
  local_328[7] = local_328[7] - dVar168;
  local_328[9] = dVar168 + local_328[9];
  local_1300 = adStack_1490[0x15] * -0.30000000000000004 +
               adStack_1490[0x13] + adStack_1490[0x13] +
               adStack_1490[0xc] * 0.5 +
               adStack_1490[6] * 5.0 + adStack_1490[1] + local_11a0 + adStack_1490[0xb] +
               adStack_1490[0xd];
  local_1308 = adStack_1490[2] * adStack_1490[10];
  local_1318 = ((local_1300 * 1e-12) / 111446030.23051862) * 8.322101603299873e+17;
  adStack_1490[0] = 7.23872375953969e-318;
  dVar52 = log10(local_1318);
  local_1310 = 1.0 / ((dVar52 + -0.1863137764834265) * -0.14 + 1.1550470206955945);
  local_1320 = (dVar52 + -0.1863137764834265) * local_1310;
  local_1328 = 1.0 / (local_1320 * local_1320 + 1.0);
  adStack_1490[0] = 7.2393166383147e-318;
  dVar52 = pow(10.0,local_1328 * -0.31893466196503506);
  dVar53 = local_1318 + 1.0;
  dVar168 = local_1328 * -0.6378693239300701 * local_1328 * local_1320 * local_1310;
  dVar169 = dVar168 * -1.1550470206955945 * local_1310;
  dVar52 = (local_1318 / dVar53) * dVar52;
  dVar209 = (local_1308 * 111446030.23051862 + adStack_1490[0xb] * -5.675915683847628) * dVar52;
  dVar168 = (local_1308 * -37261.015183856354 +
            (((local_12a8 - (dStack_12f0 + dStack_12b0)) + 1.0) * -0.0006666666666666666 +
            -0.0003343413408874632) * -5.675915683847628 * adStack_1490[0xb]) * dVar52 +
            ((local_1320 * dVar168 * -1.27 + dVar169 * -0.67 + local_1328) * -0.00011772029828908056
             + dVar169 * -0.000995959489983554 + -0.000995959489983554 / dVar53) * 2.302585092994046
            * dVar209;
  adStack_1490[0x18] = adStack_1490[0x18] - dVar209;
  adStack_1490[0x20] = adStack_1490[0x20] - dVar209;
  local_1388._0_8_ = (double)local_1388._0_8_ + dVar209;
  dVar243 = dVar52 * 111446030.23051862;
  dVar53 = (1.0 / dVar53 + dVar169) * (dVar209 / local_1300);
  if (iVar39 == 0) {
    local_1248[0] = dVar53 * 2.0;
    local_1248[1] = adStack_1490[10] * dVar243 + dVar53;
    local_1248[2] = dVar53;
    local_1248[3] = dVar53;
    auStack_1228._8_8_ = dVar53 * 6.0;
    auStack_1228._0_8_ = dVar53;
    local_1218 = dVar53;
    dStack_1210 = dVar53;
    local_1208 = dVar53;
    dStack_1200 = dVar243 * adStack_1490[2] + dVar53;
    local_11f8 = (dVar53 + dVar53) - dVar52 * 5.675915683847628;
    dStack_11f0 = dVar53 * 1.5;
    dStack_11e8 = dVar53 * 2.0;
    dStack_11d0 = dVar53;
    dStack_11c8 = dVar53;
    local_11e0 = dVar53;
    dStack_11d8 = dVar53;
    dStack_11c0 = dVar53;
    local_11b8 = dVar53 * 3.0;
    local_11b0 = dVar53;
    local_11a8 = dVar53 * 0.7;
    pdVar38 = &local_1148;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-9] = pdVar38[-9] - dVar52;
      pdVar38[-1] = pdVar38[-1] - dVar52;
      *pdVar38 = dVar52 + *pdVar38;
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    local_1190 = local_1190 - dVar53;
    local_1150 = local_1150 - dVar53;
    local_1148 = local_1148 + dVar53;
    dVar169 = adStack_1490[10] * dVar243;
    adStack_10f0[2] = adStack_10f0[2] - dVar169;
    adStack_10f0[10] = adStack_10f0[10] - dVar169;
    adStack_10f0[0xb] = dVar169 + adStack_10f0[0xb];
    dVar169 = dVar53 * 5.0;
    adStack_10f0[0x5a] = adStack_10f0[0x5a] - dVar169;
    adStack_10f0[0x62] = adStack_10f0[0x62] - dVar169;
    adStack_10f0[99] = dVar169 + adStack_10f0[99];
    dVar243 = dVar243 * adStack_1490[2];
    adStack_10f0[0xb2] = adStack_10f0[0xb2] - dVar243;
    adStack_10f0[0xba] = adStack_10f0[0xba] - dVar243;
    adStack_10f0[0xbb] = dVar243 + adStack_10f0[0xbb];
    dVar52 = dVar53 - dVar52 * 5.675915683847628;
    local_ab0._0_8_ = (double)local_ab0._0_8_ - dVar52;
    local_a70 = local_a70 - dVar52;
    local_a68 = dVar52 + local_a68;
    dVar52 = dVar53 * 0.5;
    local_a00 = local_a00 - dVar52;
    local_9c0 = local_9c0 - dVar52;
    local_9b8 = dVar52 + local_9b8;
    local_950._0_8_ = (double)local_950._0_8_ - dVar53;
    local_910 = local_910 - dVar53;
    local_908 = local_908 + dVar53;
    dVar52 = dVar53 + dVar53;
    local_530 = local_530 - dVar52;
    local_4f0 = local_4f0 - dVar52;
    local_4e8 = dVar52 + local_4e8;
    dVar53 = dVar53 * -0.30000000000000004;
    local_3d0 = local_3d0 - dVar53;
    local_390 = local_390 - dVar53;
    local_388 = dVar53 + local_388;
  }
  local_328[1] = local_328[1] - dVar168;
  local_328[9] = local_328[9] - dVar168;
  local_328[10] = dVar168 + local_328[10];
  local_1300 = adStack_1490[0x15] * -0.30000000000000004 +
               adStack_1490[0x13] + adStack_1490[0x13] +
               adStack_1490[0xc] * 0.5 +
               adStack_1490[6] * 5.0 + adStack_1490[1] + local_11a0 + adStack_1490[0xb] +
               adStack_1490[0xd];
  local_1308 = adStack_1490[2] * adStack_1490[0xe];
  local_1318 = ((local_1300 * 1e-12) / 39795255.79748703) * 5756549223630996.0;
  adStack_1490[0] = 7.24740943359358e-318;
  dVar52 = log10(local_1318);
  local_1310 = 1.0 / ((dVar52 + -0.1786261669350975) * -0.14 + 1.1696190567051137);
  local_1320 = (dVar52 + -0.1786261669350975) * local_1310;
  local_1328 = 1.0 / (local_1320 * local_1320 + 1.0);
  adStack_1490[0] = 7.24800231236859e-318;
  dVar52 = pow(10.0,local_1328 * -0.33040870606701866);
  dVar53 = local_1318 + 1.0;
  dVar168 = local_1328 * -0.6608174121340373 * local_1328 * local_1320 * local_1310;
  dVar169 = dVar168 * -1.1696190567051137 * local_1310;
  dVar52 = (local_1318 / dVar53) * dVar52;
  dVar209 = (local_1308 * 39795255.79748703 + adStack_1490[0xf] * -367.47982351959547) * dVar52;
  dVar168 = (local_1308 * 10420.408369112773 +
            (((local_1288 - (dStack_12f0 + dStack_1290)) + 1.0) * -0.0006666666666666666 +
            0.0002618505186181212) * -367.47982351959547 * adStack_1490[0xf]) * dVar52 +
            ((local_1320 * dVar168 * -1.27 + dVar169 * -0.67 + local_1328) * -0.0001220771720522275
             + dVar169 * -0.0007194001075784557 + -0.0007194001075784557 / dVar53) *
            2.302585092994046 * dVar209;
  adStack_1490[0x18] = adStack_1490[0x18] - dVar209;
  dStack_1370 = dStack_1370 - dVar209;
  dStack_1368 = dStack_1368 + dVar209;
  dVar243 = dVar52 * 39795255.79748703;
  dVar52 = dVar52 * 367.47982351959547;
  dVar53 = (1.0 / dVar53 + dVar169) * (dVar209 / local_1300);
  if (iVar39 == 0) {
    local_1248[0] = dVar53 * 2.0;
    local_1248[1] = adStack_1490[0xe] * dVar243 + dVar53;
    local_1248[2] = dVar53;
    local_1248[3] = dVar53;
    auStack_1228._8_8_ = dVar53 * 6.0;
    auStack_1228._0_8_ = dVar53;
    local_1208 = dVar53;
    dStack_1200 = dVar53;
    local_1218 = dVar53;
    dStack_1210 = dVar53;
    local_11f8 = local_1248[0];
    dStack_11f0 = dVar53 * 1.5;
    dStack_11e8 = local_1248[0];
    local_11e0 = dVar243 * adStack_1490[2] + dVar53;
    dStack_11d8 = dVar53 - dVar52;
    dStack_11d0 = dVar53;
    dStack_11c8 = dVar53;
    dStack_11c0 = dVar53;
    local_11b8 = dVar53 * 3.0;
    local_11b0 = dVar53;
    local_11a8 = dVar53 * 0.7;
    pdVar38 = &local_1128;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-0xd] = pdVar38[-0xd] - dVar52;
      pdVar38[-1] = pdVar38[-1] - dVar52;
      *pdVar38 = dVar52 + *pdVar38;
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    local_1190 = local_1190 - dVar53;
    local_1130 = local_1130 - dVar53;
    local_1128 = local_1128 + dVar53;
    dVar169 = adStack_1490[0xe] * dVar243;
    adStack_10f0[2] = adStack_10f0[2] - dVar169;
    adStack_10f0[0xe] = adStack_10f0[0xe] - dVar169;
    adStack_10f0[0xf] = dVar169 + adStack_10f0[0xf];
    dVar169 = dVar53 * 5.0;
    adStack_10f0[0x5a] = adStack_10f0[0x5a] - dVar169;
    adStack_10f0[0x66] = adStack_10f0[0x66] - dVar169;
    adStack_10f0[0x67] = dVar169 + adStack_10f0[0x67];
    local_ab0._0_8_ = (double)local_ab0._0_8_ - dVar53;
    local_a50 = local_a50 - dVar53;
    local_a48 = local_a48 + dVar53;
    dVar169 = dVar53 * 0.5;
    local_a00 = local_a00 - dVar169;
    local_9a0 = local_9a0 - dVar169;
    local_998 = dVar169 + local_998;
    local_950._0_8_ = (double)local_950._0_8_ - dVar53;
    local_8f0 = local_8f0 - dVar53;
    local_8e8 = local_8e8 + dVar53;
    dVar243 = dVar243 * adStack_1490[2];
    local_8a0 = local_8a0 - dVar243;
    local_840 = local_840 - dVar243;
    local_838 = dVar243 + local_838;
    local_7f0 = local_7f0 + dVar52;
    local_790 = local_790 + dVar52;
    local_788 = local_788 - dVar52;
    dVar52 = dVar53 + dVar53;
    local_530 = local_530 - dVar52;
    local_4d0 = local_4d0 - dVar52;
    local_4c8 = dVar52 + local_4c8;
    dVar53 = dVar53 * -0.30000000000000004;
    local_3d0 = local_3d0 - dVar53;
    local_370 = local_370 - dVar53;
    local_368 = dVar53 + local_368;
  }
  local_328[1] = local_328[1] - dVar168;
  local_328[0xd] = local_328[0xd] - dVar168;
  local_328[0xe] = dVar168 + local_328[0xe];
  local_1300 = adStack_1490[0x13] + adStack_1490[0x13] +
               adStack_1490[0xc] * 0.5 +
               adStack_1490[6] * 5.0 + adStack_1490[1] + local_11a0 + adStack_1490[0xb] +
               adStack_1490[0xd];
  local_1308 = adStack_1490[2] * adStack_1490[0xf];
  local_1318 = ((local_1300 * 1e-12) / 6244953.487472275) * 193693058799875.4;
  adStack_1490[0] = 7.25627791193643e-318;
  dVar52 = log10(local_1318);
  local_1310 = 1.0 / ((dVar52 + -0.09427787237484897) * -0.14 + 1.3295031374387192);
  local_1320 = (dVar52 + -0.09427787237484897) * local_1310;
  local_1328 = 1.0 / (local_1320 * local_1320 + 1.0);
  adStack_1490[0] = 7.25687079071144e-318;
  dVar52 = pow(10.0,local_1328 * -0.4563016830226135);
  dVar53 = local_1318 + 1.0;
  dVar168 = local_1328 * -0.912603366045227 * local_1328 * local_1320 * local_1310;
  dVar169 = dVar168 * -1.3295031374387192 * local_1310;
  dVar52 = (local_1318 / dVar53) * dVar52;
  dVar209 = (local_1308 * 6244953.487472275 + adStack_1490[0x10] * -27501071940.071716) * dVar52;
  dVar168 = (local_1308 * 5521.547321046288 +
            (((dStack_1280 - (dStack_12f0 + local_1288)) + 1.0) * -0.0006666666666666666 +
            0.0008841614804854543) * -27501071940.071716 * adStack_1490[0x10]) * dVar52 +
            ((local_1320 * dVar168 * -1.27 + dVar169 * -0.67 + local_1328) * -8.975305961941277e-05
             + dVar169 * -0.001233681740997213 + -0.001233681740997213 / dVar53) * 2.302585092994046
            * dVar209;
  adStack_1490[0x18] = adStack_1490[0x18] - dVar209;
  dStack_1368 = dStack_1368 - dVar209;
  local_1360 = local_1360 + dVar209;
  dVar243 = dVar52 * 6244953.487472275;
  dVar52 = dVar52 * 27501071940.071716;
  dVar53 = (1.0 / dVar53 + dVar169) * (dVar209 / local_1300);
  if (iVar39 == 0) {
    local_1248[0] = dVar53 * 2.0;
    local_1248[1] = adStack_1490[0xf] * dVar243 + dVar53;
    local_1248[2] = dVar53;
    local_1248[3] = dVar53;
    auStack_1228._8_8_ = dVar53 * 6.0;
    auStack_1228._0_8_ = dVar53;
    local_1208 = dVar53;
    dStack_1200 = dVar53;
    local_1218 = dVar53;
    dStack_1210 = dVar53;
    local_11f8 = local_1248[0];
    dStack_11f0 = dVar53 * 1.5;
    dStack_11e8 = local_1248[0];
    local_11e0 = dVar53;
    dStack_11d8 = dVar243 * adStack_1490[2] + dVar53;
    dStack_11d0 = dVar53 - dVar52;
    dStack_11c8 = dVar53;
    dStack_11c0 = dVar53;
    local_11b8 = dVar53 * 3.0;
    local_11b0 = dVar53;
    local_11a8 = dVar53;
    pdVar38 = &local_1120;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-0xe] = pdVar38[-0xe] - dVar52;
      pdVar38[-1] = pdVar38[-1] - dVar52;
      *pdVar38 = dVar52 + *pdVar38;
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    local_1190 = local_1190 - dVar53;
    local_1128 = local_1128 - dVar53;
    local_1120 = local_1120 + dVar53;
    dVar169 = adStack_1490[0xf] * dVar243;
    adStack_10f0[2] = adStack_10f0[2] - dVar169;
    adStack_10f0[0xf] = adStack_10f0[0xf] - dVar169;
    adStack_10f0[0x10] = dVar169 + adStack_10f0[0x10];
    dVar169 = dVar53 * 5.0;
    adStack_10f0[0x5a] = adStack_10f0[0x5a] - dVar169;
    adStack_10f0[0x67] = adStack_10f0[0x67] - dVar169;
    adStack_10f0[0x68] = dVar169 + adStack_10f0[0x68];
    local_ab0._0_8_ = (double)local_ab0._0_8_ - dVar53;
    local_a48 = local_a48 - dVar53;
    local_a40 = local_a40 + dVar53;
    dVar169 = dVar53 * 0.5;
    local_a00 = local_a00 - dVar169;
    local_998 = local_998 - dVar169;
    local_990 = dVar169 + local_990;
    local_950._0_8_ = (double)local_950._0_8_ - dVar53;
    local_8e8 = local_8e8 - dVar53;
    local_8e0 = local_8e0 + dVar53;
    dVar243 = dVar243 * adStack_1490[2];
    local_7f0 = local_7f0 - dVar243;
    local_788 = local_788 - dVar243;
    local_780 = dVar243 + local_780;
    local_740 = local_740 + dVar52;
    local_6d8 = local_6d8 + dVar52;
    local_6d0 = local_6d0 - dVar52;
    dVar53 = dVar53 + dVar53;
    local_530 = local_530 - dVar53;
    local_4c8 = local_4c8 - dVar53;
    local_4c0 = dVar53 + local_4c0;
  }
  local_328[1] = local_328[1] - dVar168;
  local_328[0xe] = local_328[0xe] - dVar168;
  local_328[0xf] = dVar168 + local_328[0xf];
  local_1300 = adStack_1490[0x15] * -0.30000000000000004 +
               adStack_1490[0x13] + adStack_1490[0x13] +
               adStack_1490[0xc] * 0.5 +
               adStack_1490[6] * 5.0 + adStack_1490[1] + local_11a0 + adStack_1490[0xb] +
               adStack_1490[0xd];
  local_1308 = adStack_1490[2] * adStack_1490[0x11];
  local_1318 = ((local_1300 * 1e-12) / 16225653.552515732) * 7.275514395950915e+16;
  adStack_1490[0] = 7.26485983220469e-318;
  dVar52 = log10(local_1318);
  local_1310 = 1.0 / ((dVar52 + -0.015265883794403325) * -0.14 + 1.4792721307180714);
  local_1320 = (dVar52 + -0.015265883794403325) * local_1310;
  local_1328 = 1.0 / (local_1320 * local_1320 + 1.0);
  adStack_1490[0] = 7.2654527109797e-318;
  dVar52 = pow(10.0,local_1328 * -0.5742300241874577);
  dVar53 = local_1318 + 1.0;
  dVar168 = local_1328 * -1.1484600483749154 * local_1328 * local_1320 * local_1310;
  dVar169 = dVar168 * -1.4792721307180714 * local_1310;
  dVar52 = (local_1318 / dVar53) * dVar52;
  dVar209 = (local_1308 * 16225653.552515732 + adStack_1490[0x12] * -67434469.58138922) * dVar52;
  dVar168 = (local_1308 * 11515.557849353894 +
            (((dStack_1270 - (dStack_12f0 + local_1278)) + 1.0) * -0.0006666666666666666 +
            0.0007097130363398179) * -67434469.58138922 * adStack_1490[0x12]) * dVar52 +
            ((local_1320 * dVar168 * -1.27 + dVar169 * -0.67 + local_1328) * -0.00018029438599527205
             + dVar169 * -0.0018374389917122033 + -0.0018374389917122033 / dVar53) *
            2.302585092994046 * dVar209;
  adStack_1490[0x18] = adStack_1490[0x18] - dVar209;
  dStack_1358 = dStack_1358 - dVar209;
  dStack_1350 = dStack_1350 + dVar209;
  dVar243 = dVar52 * 16225653.552515732;
  dVar52 = dVar52 * 67434469.58138922;
  dVar53 = (1.0 / dVar53 + dVar169) * (dVar209 / local_1300);
  if (iVar39 == 0) {
    local_1248[0] = dVar53 * 2.0;
    local_1248[1] = adStack_1490[0x11] * dVar243 + dVar53;
    local_1248[2] = dVar53;
    local_1248[3] = dVar53;
    auStack_1228._8_8_ = dVar53 * 6.0;
    auStack_1228._0_8_ = dVar53;
    local_1208 = dVar53;
    dStack_1200 = dVar53;
    local_1218 = dVar53;
    dStack_1210 = dVar53;
    local_11f8 = local_1248[0];
    dStack_11f0 = dVar53 * 1.5;
    dStack_11e8 = local_1248[0];
    local_11e0 = dVar53;
    dStack_11d8 = dVar53;
    dStack_11d0 = dVar53;
    dStack_11c8 = dVar243 * adStack_1490[2] + dVar53;
    dStack_11c0 = dVar53 - dVar52;
    local_11b8 = dVar53 * 3.0;
    local_11b0 = dVar53;
    local_11a8 = dVar53 * 0.7;
    pdVar38 = &local_1110;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-0x10] = pdVar38[-0x10] - dVar52;
      pdVar38[-1] = pdVar38[-1] - dVar52;
      *pdVar38 = dVar52 + *pdVar38;
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    local_1190 = local_1190 - dVar53;
    local_1118 = local_1118 - dVar53;
    local_1110 = local_1110 + dVar53;
    dVar169 = adStack_1490[0x11] * dVar243;
    adStack_10f0[2] = adStack_10f0[2] - dVar169;
    adStack_10f0[0x11] = adStack_10f0[0x11] - dVar169;
    adStack_10f0[0x12] = dVar169 + adStack_10f0[0x12];
    dVar169 = dVar53 * 5.0;
    adStack_10f0[0x5a] = adStack_10f0[0x5a] - dVar169;
    adStack_10f0[0x69] = adStack_10f0[0x69] - dVar169;
    adStack_10f0[0x6a] = dVar169 + adStack_10f0[0x6a];
    local_ab0._0_8_ = (double)local_ab0._0_8_ - dVar53;
    local_a38 = local_a38 - dVar53;
    local_a30 = local_a30 + dVar53;
    dVar169 = dVar53 * 0.5;
    local_a00 = local_a00 - dVar169;
    local_988 = local_988 - dVar169;
    local_980 = dVar169 + local_980;
    local_950._0_8_ = (double)local_950._0_8_ - dVar53;
    local_8d8 = local_8d8 - dVar53;
    local_8d0 = local_8d0 + dVar53;
    dVar243 = dVar243 * adStack_1490[2];
    local_690 = local_690 - dVar243;
    local_618 = local_618 - dVar243;
    local_610 = dVar243 + local_610;
    local_5e0 = local_5e0 + dVar52;
    local_568 = local_568 + dVar52;
    local_560 = local_560 - dVar52;
    dVar52 = dVar53 + dVar53;
    local_530 = local_530 - dVar52;
    local_4b8 = local_4b8 - dVar52;
    local_4b0 = dVar52 + local_4b0;
    dVar53 = dVar53 * -0.30000000000000004;
    local_3d0 = local_3d0 - dVar53;
    local_358 = local_358 - dVar53;
    local_350 = dVar53 + local_350;
  }
  local_328[1] = local_328[1] - dVar168;
  local_328[0x10] = local_328[0x10] - dVar168;
  local_328[0x11] = dVar168 + local_328[0x11];
  local_1300 = adStack_1490[0x15] * -0.30000000000000004 +
               adStack_1490[0x13] + adStack_1490[0x13] +
               adStack_1490[0xc] * 0.5 +
               adStack_1490[6] * 5.0 + adStack_1490[1] + local_11a0 + adStack_1490[0xb] +
               adStack_1490[0xd];
  local_1308 = adStack_1490[2] * adStack_1490[0x12];
  local_1318 = ((local_1300 * 1e-12) / 219941642.44158944) * 6.888873607161395e+17;
  adStack_1490[0] = 7.27389135221067e-318;
  dVar52 = log10(local_1318);
  local_1310 = 1.0 / ((dVar52 + -0.1601631500988638) * -0.14 + 1.2046161184693178);
  local_1320 = (dVar52 + -0.1601631500988638) * local_1310;
  local_1328 = 1.0 / (local_1320 * local_1320 + 1.0);
  adStack_1490[0] = 7.27448423098568e-318;
  dVar52 = pow(10.0,local_1328 * -0.35796544761363613);
  dVar53 = local_1318 + 1.0;
  dVar168 = local_1328 * -0.7159308952272723 * local_1328 * local_1320 * local_1310;
  local_1310 = dVar168 * -1.2046161184693178 * local_1310;
  dVar52 = (local_1318 / dVar53) * dVar52;
  dVar169 = (local_1308 * 219941642.44158944 + adStack_1490[0x13] * -123.84112181745292) * dVar52;
  dVar168 = (local_1308 * -67440.72224696395 +
            (((local_1268 - (dStack_12f0 + dStack_1270)) + 1.0) * -0.0006666666666666666 +
            -0.0003066300746793522) * -123.84112181745292 * adStack_1490[0x13]) * dVar52 +
            ((local_1320 * dVar168 * -1.27 + local_1310 * -0.67 + local_1328) *
             -0.00016037027791424038 + local_1310 * -0.001267383041404717 +
            -0.001267383041404717 / dVar53) * 2.302585092994046 * dVar169;
  adStack_1490[0x18] = adStack_1490[0x18] - dVar169;
  dStack_1350 = dStack_1350 - dVar169;
  local_1348 = local_1348 + dVar169;
  dVar209 = dVar52 * 219941642.44158944;
  dVar53 = (1.0 / dVar53 + local_1310) * (dVar169 / local_1300);
  if (iVar39 == 0) {
    local_1248[0] = dVar53 * 2.0;
    local_1248[1] = adStack_1490[0x12] * dVar209 + dVar53;
    local_1248[2] = dVar53;
    local_1248[3] = dVar53;
    auStack_1228._8_8_ = dVar53 * 6.0;
    auStack_1228._0_8_ = dVar53;
    local_1208 = dVar53;
    dStack_1200 = dVar53;
    local_1218 = dVar53;
    dStack_1210 = dVar53;
    local_11f8 = local_1248[0];
    dStack_11f0 = dVar53 * 1.5;
    dStack_11e8 = local_1248[0];
    dStack_11d0 = dVar53;
    dStack_11c8 = dVar53;
    local_11e0 = dVar53;
    dStack_11d8 = dVar53;
    dStack_11c0 = dVar209 * adStack_1490[2] + dVar53;
    local_11b8 = dVar53 * 3.0 - dVar52 * 123.84112181745292;
    local_11b0 = dVar53;
    local_11a8 = dVar53 * 0.7;
    pdVar38 = local_1108;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-0x11] = pdVar38[-0x11] - dVar52;
      pdVar38[-1] = pdVar38[-1] - dVar52;
      *pdVar38 = dVar52 + *pdVar38;
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    local_1190 = local_1190 - dVar53;
    local_1110 = local_1110 - dVar53;
    local_1108[0] = local_1108[0] + dVar53;
    dVar169 = adStack_1490[0x12] * dVar209;
    adStack_10f0[2] = adStack_10f0[2] - dVar169;
    adStack_10f0[0x12] = adStack_10f0[0x12] - dVar169;
    adStack_10f0[0x13] = dVar169 + adStack_10f0[0x13];
    dVar169 = dVar53 * 5.0;
    adStack_10f0[0x5a] = adStack_10f0[0x5a] - dVar169;
    adStack_10f0[0x6a] = adStack_10f0[0x6a] - dVar169;
    adStack_10f0[0x6b] = dVar169 + adStack_10f0[0x6b];
    local_ab0._0_8_ = (double)local_ab0._0_8_ - dVar53;
    local_a30 = local_a30 - dVar53;
    local_a28 = local_a28 + dVar53;
    dVar169 = dVar53 * 0.5;
    local_a00 = local_a00 - dVar169;
    local_980 = local_980 - dVar169;
    local_978 = dVar169 + local_978;
    local_950._0_8_ = (double)local_950._0_8_ - dVar53;
    local_8d0 = local_8d0 - dVar53;
    local_8c8 = local_8c8 + dVar53;
    dVar209 = dVar209 * adStack_1490[2];
    local_5e0 = local_5e0 - dVar209;
    local_560 = local_560 - dVar209;
    local_558 = dVar209 + local_558;
    dVar52 = (dVar53 + dVar53) - dVar52 * 123.84112181745292;
    local_530 = local_530 - dVar52;
    local_4b0 = local_4b0 - dVar52;
    local_4a8 = dVar52 + local_4a8;
    dVar53 = dVar53 * -0.30000000000000004;
    local_3d0 = local_3d0 - dVar53;
    local_350 = local_350 - dVar53;
    local_348 = dVar53 + local_348;
  }
  local_328[1] = local_328[1] - dVar168;
  local_328[0x11] = local_328[0x11] - dVar168;
  local_328[0x12] = dVar168 + local_328[0x12];
  local_1308 = adStack_1490[1];
  local_1310 = adStack_1490[0xc];
  local_1300 = adStack_1490[0x15] * -0.30000000000000004 +
               adStack_1490[0x13] + adStack_1490[0x13] +
               adStack_1490[0xc] * 0.5 +
               adStack_1490[6] * 5.0 + local_11a0 + adStack_1490[1] + adStack_1490[0xb] +
               adStack_1490[0xd];
  local_1320 = ((local_1300 * 1e-12) / 6.312363615626772e-06) * 35752.450724543516;
  adStack_1490[0] = 7.28254738232581e-318;
  dVar52 = log10(local_1320);
  local_1318 = 1.0 / ((dVar52 + -0.09697718965666909) * -0.14 + 1.3243865210985526);
  local_1328 = (dVar52 + -0.09697718965666909) * local_1318;
  local_270 = 1.0 / (local_1328 * local_1328 + 1.0);
  adStack_1490[0] = 7.28314026110082e-318;
  dVar52 = pow(10.0,local_270 * -0.45227285125870287);
  dVar53 = local_1320 + 1.0;
  dVar168 = local_270 * -0.9045457025174057 * local_270 * local_1328 * local_1318;
  local_1318 = dVar168 * -1.3243865210985526 * local_1318;
  dVar52 = (local_1320 / dVar53) * dVar52;
  dVar169 = (local_1308 * local_1310 * 6.312363615626772e-06 +
            adStack_1490[0xf] * -115.13226896846228) * dVar52;
  dVar209 = (local_1308 * local_1310 * 1.1868939967403452e-07 +
            (((local_1288 - (local_12f8 + dStack_12a0)) + 1.0) * -0.0006666666666666666 +
            0.01880268737691365) * -115.13226896846228 * adStack_1490[0xf]) * dVar52 +
            ((local_1328 * dVar168 * -1.27 + local_1318 * -0.67 + local_270) *
             -0.0002754907583934973 + local_1318 * -0.0009631147670810994 +
            -0.0009631147670810994 / dVar53) * 2.302585092994046 * dVar169;
  adStack_1490[0x17] = adStack_1490[0x17] - dVar169;
  local_1388._8_8_ = (double)local_1388._8_8_ - dVar169;
  dStack_1368 = dStack_1368 + dVar169;
  dVar243 = dVar52 * 6.312363615626772e-06;
  dVar52 = dVar52 * 115.13226896846228;
  dVar53 = (1.0 / dVar53 + local_1318) * (dVar169 / local_1300);
  dVar168 = dVar53 + dVar53;
  if (iVar39 == 0) {
    local_1248[0] = adStack_1490[0xc] * dVar243 + dVar168;
    local_1248[3] = dVar53;
    local_1248[1] = dVar53;
    local_1248[2] = dVar53;
    auStack_1228._8_8_ = dVar53 * 6.0;
    auStack_1228._0_8_ = dVar53;
    local_1208 = dVar53;
    dStack_1200 = dVar53;
    local_1218 = dVar53;
    dStack_1210 = dVar53;
    local_11f8 = dVar168;
    dStack_11f0 = dVar53 * 1.5 + dVar243 * adStack_1490[1];
    dStack_11e8 = dVar168;
    local_11e0 = dVar53;
    dStack_11d8 = dVar53 - dVar52;
    dStack_11d0 = dVar53;
    dStack_11c8 = dVar53;
    dStack_11c0 = dVar53;
    local_11b8 = dVar53 * 3.0;
    local_11b0 = dVar53;
    local_11a8 = dVar53 * 0.7;
    pdVar38 = &local_1128;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-0xe] = pdVar38[-0xe] - dVar52;
      pdVar38[-3] = pdVar38[-3] - dVar52;
      *pdVar38 = dVar52 + *pdVar38;
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    dVar169 = adStack_1490[0xc] * dVar243 + dVar53;
    local_1198 = local_1198 - dVar169;
    local_1140 = local_1140 - dVar169;
    local_1128 = dVar169 + local_1128;
    dVar169 = dVar53 * 5.0;
    adStack_10f0[0x59] = adStack_10f0[0x59] - dVar169;
    adStack_10f0[100] = adStack_10f0[100] - dVar169;
    adStack_10f0[0x67] = dVar169 + adStack_10f0[0x67];
    adStack_10f0[199] = adStack_10f0[199] - dVar53;
    dStack_a60 = dStack_a60 - dVar53;
    local_a48 = local_a48 + dVar53;
    dVar169 = dVar53 * 0.5 + dVar243 * adStack_1490[1];
    local_a08 = local_a08 - dVar169;
    dStack_9b0 = dStack_9b0 - dVar169;
    local_998 = dVar169 + local_998;
    local_958 = local_958 - dVar53;
    local_900 = local_900 - dVar53;
    local_8e8 = local_8e8 + dVar53;
    local_7f8 = local_7f8 + dVar52;
    local_7a0 = local_7a0 + dVar52;
    local_788 = local_788 - dVar52;
    local_538 = local_538 - dVar168;
    local_4e0 = local_4e0 - dVar168;
    local_4c8 = dVar168 + local_4c8;
    dVar53 = dVar53 * -0.30000000000000004;
    local_3d8 = local_3d8 - dVar53;
    local_380 = local_380 - dVar53;
    local_368 = dVar53 + local_368;
  }
  local_328[0] = local_328[0] - dVar209;
  local_328[0xb] = local_328[0xb] - dVar209;
  local_328[0xe] = dVar209 + local_328[0xe];
  local_1308 = adStack_1490[10];
  local_1300 = adStack_1490[0x15] * -0.30000000000000004 +
               adStack_1490[0x13] + adStack_1490[0x13] +
               adStack_1490[0xc] * 0.5 +
               adStack_1490[6] * 5.0 + adStack_1490[1] + local_11a0 + adStack_1490[0xb] +
               adStack_1490[0xd];
  local_1318 = ((local_1300 * 1e-12) / 14295380.788738592) * 4.2554035761159823e+18;
  adStack_1490[0] = 7.29087732911469e-318;
  dVar52 = log10(local_1318);
  local_1310 = 1.0 / ((dVar52 + 0.12973051019251233) * -0.14 + 1.7541160417081951);
  local_1320 = (dVar52 + 0.12973051019251233) * local_1310;
  local_1328 = 1.0 / (local_1320 * local_1320 + 1.0);
  adStack_1490[0] = 7.2914702078897e-318;
  dVar52 = pow(10.0,local_1328 * -0.7906425525261378);
  dVar53 = local_1318 + 1.0;
  dVar168 = local_1328 * -1.5812851050522756 * local_1328 * local_1320 * local_1310;
  local_1310 = dVar168 * -1.7541160417081951 * local_1310;
  dVar52 = (local_1318 / dVar53) * dVar52;
  dVar169 = (local_1308 * local_1308 * 14295380.788738592 + adStack_1490[0x13] * -4338.16492800087)
            * dVar52;
  dVar168 = (local_1308 * local_1308 * -7262.089447255807 +
            (((local_1268 - (dStack_12b0 + dStack_12b0)) + 1.0) * -0.0006666666666666666 +
            -0.0005080025187560327) * -4338.16492800087 * adStack_1490[0x13]) * dVar52 +
            ((local_1320 * dVar168 * -1.27 + local_1310 * -0.67 + local_1328) *
             -0.00010911464158415095 + local_1310 * -0.001974975711261012 +
            -0.001974975711261012 / dVar53) * 2.302585092994046 * dVar169;
  adStack_1490[0x20] = adStack_1490[0x20] - (dVar169 + dVar169);
  local_1348 = local_1348 + dVar169;
  dVar209 = dVar52 * 14295380.788738592;
  local_1248[3] = (1.0 / dVar53 + local_1310) * (dVar169 / local_1300);
  if (iVar39 == 0) {
    local_1248[0] = local_1248[3] * 2.0;
    local_1248[1] = local_1248[3];
    local_1248[2] = local_1248[3];
    auStack_1228._8_8_ = local_1248[3] * 6.0;
    auStack_1228._0_8_ = local_1248[3];
    local_1218 = local_1248[3];
    dStack_1210 = local_1248[3];
    local_1208 = local_1248[3];
    dStack_1200 = (dVar209 + dVar209) * adStack_1490[10] + local_1248[3];
    local_11f8 = local_1248[0];
    dStack_11f0 = local_1248[3] * 1.5;
    dStack_11e8 = local_1248[0];
    dStack_11d0 = local_1248[3];
    dStack_11c8 = local_1248[3];
    local_11e0 = local_1248[3];
    dStack_11d8 = local_1248[3];
    dStack_11c0 = local_1248[3];
    local_11b8 = local_1248[3] * 3.0 - dVar52 * 4338.16492800087;
    local_11b0 = local_1248[3];
    local_11a8 = local_1248[3] * 0.7;
    pdVar38 = &local_1150;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      *pdVar38 = *pdVar38 - (dVar52 + dVar52);
      pdVar38[9] = dVar52 + pdVar38[9];
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    dVar53 = local_1248[3] * -2.0;
    local_1150 = local_1150 + dVar53;
    local_1108[0] = local_1108[0] + local_1248[3];
    dVar169 = local_1248[3] * 5.0;
    adStack_10f0[0x62] = adStack_10f0[0x62] - (dVar169 + dVar169);
    adStack_10f0[0x6b] = dVar169 + adStack_10f0[0x6b];
    dVar169 = (dVar209 + dVar209) * adStack_1490[10];
    adStack_10f0[0xba] = adStack_10f0[0xba] - (dVar169 + dVar169);
    adStack_10f0[0xc3] = dVar169 + adStack_10f0[0xc3];
    local_a70 = local_a70 + dVar53;
    local_a28 = local_a28 + local_1248[3];
    dVar169 = local_1248[3] * 0.5;
    local_9c0 = local_9c0 - (dVar169 + dVar169);
    local_978 = dVar169 + local_978;
    local_910 = dVar53 + local_910;
    local_8c8 = local_8c8 + local_1248[3];
    dVar52 = (local_1248[3] + local_1248[3]) - dVar52 * 4338.16492800087;
    local_4f0 = local_4f0 - (dVar52 + dVar52);
    local_4a8 = dVar52 + local_4a8;
    local_1248[3] = local_1248[3] * -0.30000000000000004;
    local_390 = local_390 - (local_1248[3] + local_1248[3]);
    local_348 = local_1248[3] + local_348;
  }
  local_328[9] = local_328[9] - (dVar168 + dVar168);
  local_328[0x12] = dVar168 + local_328[0x12];
  dVar52 = adStack_1490[0x15] * -0.30000000000000004 +
           adStack_1490[0x13] + adStack_1490[0x13] +
           adStack_1490[0xc] * 0.5 +
           adStack_1490[6] * 5.0 + adStack_1490[1] + local_11a0 + adStack_1490[0xb] +
           adStack_1490[0xd];
  local_1248[3] =
       adStack_1490[2] * adStack_1490[3] * 333.3333333333333 +
       adStack_1490[5] * -7.276980120178465e-07;
  dVar209 = dVar52 * local_1248[3];
  dVar53 = (adStack_1490[2] * adStack_1490[3] * -0.2222222222222222 +
           (((local_12d8 - (dStack_12f0 + local_12e8)) + 1.0) * -0.0006666666666666666 +
           -0.0006666666666666666) * -7.276980120178465e-07 * adStack_1490[5]) * dVar52;
  adStack_1490[0x18] = adStack_1490[0x18] - dVar209;
  dVar169 = adStack_1490[0x19] - dVar209;
  adStack_1490[0x19] = dVar169;
  dVar209 = dVar209 + adStack_1490[0x1b];
  adStack_1490[0x1b] = dVar209;
  dVar168 = dVar52 * 333.3333333333333;
  dVar52 = dVar52 * 7.276980120178465e-07;
  if (iVar39 == 0) {
    local_1248[0] = local_1248[3] * 2.0;
    local_1248[1] = dVar168 * adStack_1490[3] + local_1248[3];
    local_1248[2] = dVar168 * adStack_1490[2] + local_1248[3];
    auStack_1228._8_8_ = local_1248[3] * 6.0;
    auStack_1228._0_8_ = local_1248[3] - dVar52;
    local_1208 = local_1248[3];
    dStack_1200 = local_1248[3];
    local_1218 = local_1248[3];
    dStack_1210 = local_1248[3];
    local_11f8 = local_1248[0];
    dStack_11f0 = local_1248[3] * 1.5;
    dStack_11e8 = local_1248[0];
    dStack_11d0 = local_1248[3];
    dStack_11c8 = local_1248[3];
    local_11e0 = local_1248[3];
    dStack_11d8 = local_1248[3];
    dStack_11c0 = local_1248[3];
    local_11b8 = local_1248[3] * 3.0;
    local_11b0 = local_1248[3];
    local_11a8 = local_1248[3] * 0.7;
    pauVar37 = (undefined1 (*) [16])&local_1190;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      dVar168 = *(double *)(*pauVar37 + 8) - dVar52;
      auVar19._8_4_ = SUB84(dVar168,0);
      auVar19._0_8_ = *(double *)*pauVar37 - dVar52;
      auVar19._12_4_ = (int)((ulong)dVar168 >> 0x20);
      *pauVar37 = auVar19;
      *(double *)(pauVar37[1] + 8) = dVar52 + *(double *)(pauVar37[1] + 8);
      lVar36 = lVar36 + 1;
      pauVar37 = pauVar37 + 0xb;
    } while (lVar36 != 0x15);
  }
  else {
    local_1190 = local_1190 - local_1248[3];
    dStack_1188 = dStack_1188 - local_1248[3];
    local_1178 = local_1178 + local_1248[3];
    dVar243 = adStack_1490[3] * dVar168;
    adStack_10f0[2] = adStack_10f0[2] - dVar243;
    adStack_10f0[3] = adStack_10f0[3] - dVar243;
    adStack_10f0[5] = dVar243 + adStack_10f0[5];
    dVar168 = dVar168 * adStack_1490[2];
    adStack_10f0[0x18] = adStack_10f0[0x18] - dVar168;
    adStack_10f0[0x19] = adStack_10f0[0x19] - dVar168;
    adStack_10f0[0x1b] = dVar168 + adStack_10f0[0x1b];
    adStack_10f0[0x44] = dVar52 + adStack_10f0[0x44];
    adStack_10f0[0x45] = dVar52 + adStack_10f0[0x45];
    adStack_10f0[0x47] = adStack_10f0[0x47] - dVar52;
    dVar52 = local_1248[3] * 5.0;
    adStack_10f0[0x5a] = adStack_10f0[0x5a] - dVar52;
    adStack_10f0[0x5b] = adStack_10f0[0x5b] - dVar52;
    adStack_10f0[0x5d] = dVar52 + adStack_10f0[0x5d];
    auVar1._8_4_ = SUB84((double)local_ab0._8_8_ - local_1248[3],0);
    auVar1._0_8_ = (double)local_ab0._0_8_ - local_1248[3];
    auVar1._12_4_ = (int)((ulong)((double)local_ab0._8_8_ - local_1248[3]) >> 0x20);
    local_ab0 = auVar1;
    local_a98 = local_a98 + local_1248[3];
    dVar52 = local_1248[3] * 0.5;
    local_a00 = local_a00 - dVar52;
    dStack_9f8 = dStack_9f8 - dVar52;
    local_9e8 = dVar52 + local_9e8;
    auVar2._8_4_ = SUB84((double)local_950._8_8_ - local_1248[3],0);
    auVar2._0_8_ = (double)local_950._0_8_ - local_1248[3];
    auVar2._12_4_ = (int)((ulong)((double)local_950._8_8_ - local_1248[3]) >> 0x20);
    local_950 = auVar2;
    local_938 = local_938 + local_1248[3];
    dVar52 = local_1248[3] + local_1248[3];
    local_530 = local_530 - dVar52;
    dStack_528 = dStack_528 - dVar52;
    local_518 = dVar52 + local_518;
    local_1248[3] = local_1248[3] * -0.30000000000000004;
    local_3d0 = local_3d0 - local_1248[3];
    dStack_3c8 = dStack_3c8 - local_1248[3];
    local_3b8 = local_1248[3] + local_3b8;
  }
  local_328[1] = local_328[1] - dVar53;
  local_328[2] = local_328[2] - dVar53;
  local_328[4] = dVar53 + local_328[4];
  dVar52 = adStack_1490[0x15] * -0.5 +
           adStack_1490[0x13] + adStack_1490[0x13] +
           adStack_1490[0xd] * 2.5 +
           adStack_1490[0xc] * 0.5 +
           adStack_1490[6] * 5.0 + adStack_1490[4] * 5.0 + adStack_1490[1] + local_11a0 +
           adStack_1490[0xb];
  local_1248[1] =
       adStack_1490[0xc] * adStack_1490[3] * 220.0432490668822 +
       adStack_1490[0xd] * -3.54614235835121e-08;
  dVar53 = dVar52 * local_1248[1];
  adStack_1490[0x19] = dVar169 - dVar53;
  local_1388._8_8_ = (double)local_1388._8_8_ - dVar53;
  local_1378 = dVar53 + local_1378;
  dVar53 = (adStack_1490[0xc] * adStack_1490[3] * 0.14763924017103203 +
           (((local_1298 - (local_12e8 + dStack_12a0)) + 1.0) * -0.0006666666666666666 +
           0.0006709555544062933) * -3.54614235835121e-08 * adStack_1490[0xd]) * dVar52;
  dVar168 = dVar52 * 220.0432490668822;
  local_1248[0] = local_1248[1] + local_1248[1];
  if (iVar39 == 0) {
    local_1248[2] = adStack_1490[0xc] * dVar168 + local_1248[1];
    auStack_1228._8_8_ = local_1248[1] * 6.0;
    local_1248[3] = (double)auStack_1228._8_8_;
    auStack_1228._0_8_ = local_1248[1];
    local_1208 = local_1248[1];
    dStack_1200 = local_1248[1];
    local_1218 = local_1248[1];
    dStack_1210 = local_1248[1];
    local_11f8 = local_1248[0];
    dStack_11f0 = local_1248[1] * 1.5 + dVar168 * adStack_1490[3];
    dVar52 = local_1248[1] * 3.5 + -(dVar52 * 3.54614235835121e-08);
    auVar18._8_4_ = SUB84(dVar52,0);
    auVar18._0_8_ = dStack_11f0;
    auVar18._12_4_ = (int)((ulong)dVar52 >> 0x20);
    dStack_11e8 = auVar18._8_8_;
    dStack_11d0 = local_1248[1];
    dStack_11c8 = local_1248[1];
    local_11e0 = local_1248[1];
    dStack_11d8 = local_1248[1];
    dStack_11c0 = local_1248[1];
    local_11b8 = local_1248[1] * 3.0;
    local_11b0 = local_1248[1];
    local_11a8 = local_1248[1] * 0.5;
    pdVar38 = &local_1138;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-10] = pdVar38[-10] - dVar52;
      pdVar38[-1] = pdVar38[-1] - dVar52;
      *pdVar38 = dVar52 + *pdVar38;
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    dStack_1188 = dStack_1188 - local_1248[1];
    local_1140 = local_1140 - local_1248[1];
    local_1138 = local_1138 + local_1248[1];
    dVar169 = adStack_1490[0xc] * dVar168;
    adStack_10f0[0x19] = adStack_10f0[0x19] - dVar169;
    adStack_10f0[0x22] = adStack_10f0[0x22] - dVar169;
    adStack_10f0[0x23] = dVar169 + adStack_10f0[0x23];
    dVar169 = local_1248[1] * 5.0;
    adStack_10f0[0x2f] = adStack_10f0[0x2f] - dVar169;
    adStack_10f0[0x38] = adStack_10f0[0x38] - dVar169;
    adStack_10f0[0x39] = adStack_10f0[0x39] + dVar169;
    adStack_10f0[0x5b] = adStack_10f0[0x5b] - dVar169;
    adStack_10f0[100] = adStack_10f0[100] - dVar169;
    adStack_10f0[0x65] = dVar169 + adStack_10f0[0x65];
    local_ab0._8_8_ = (double)local_ab0._8_8_ - local_1248[1];
    dStack_a60 = dStack_a60 - local_1248[1];
    local_a58 = local_a58 + local_1248[1];
    dVar168 = local_1248[1] * 0.5 + dVar168 * adStack_1490[3];
    dStack_9f8 = dStack_9f8 - dVar168;
    dStack_9b0 = dStack_9b0 - dVar168;
    local_9a8 = dVar168 + local_9a8;
    dVar52 = local_1248[1] * 2.5 - dVar52 * 3.54614235835121e-08;
    local_950._8_8_ = (double)local_950._8_8_ - dVar52;
    local_900 = local_900 - dVar52;
    local_8f8 = dVar52 + local_8f8;
    dStack_528 = dStack_528 - local_1248[0];
    local_4e0 = local_4e0 - local_1248[0];
    local_4d8 = local_1248[0] + local_4d8;
    local_1248[1] = local_1248[1] * -0.5;
    dStack_3c8 = dStack_3c8 - local_1248[1];
    local_380 = local_380 - local_1248[1];
    local_378 = local_1248[1] + local_378;
  }
  local_328[2] = local_328[2] - dVar53;
  local_328[0xc] = dVar53 + local_328[0xc];
  local_328[0xb] = local_328[0xb] - dVar53;
  dVar52 = ((adStack_1490[0x13] * 0.5 +
            adStack_1490[0xd] * 0.5 +
            adStack_1490[0xc] * -0.25 + ((local_11a0 - adStack_1490[4]) - adStack_1490[6])) -
           adStack_1490[0x14]) - adStack_1490[0x15];
  local_1248[0] =
       adStack_1490[4] * adStack_1490[2] * 5196.603105918946 + adStack_1490[7] * -515.2276090538855;
  dVar168 = dVar52 * local_1248[0];
  dVar53 = (adStack_1490[4] * adStack_1490[2] * -2.979385780726863 +
           (((local_12c8 - (dStack_12f0 + dStack_12e0)) + 1.0) * -0.0006666666666666666 +
           -0.0005733333333333334) * -515.2276090538855 * adStack_1490[7]) * dVar52;
  adStack_1490[0x18] = adStack_1490[0x18] - dVar168;
  adStack_1490[0x1a] = adStack_1490[0x1a] - dVar168;
  adStack_1490[0x1d] = dVar168 + adStack_1490[0x1d];
  dVar168 = dVar52 * 5196.603105918946;
  dVar52 = dVar52 * 515.2276090538855;
  if (iVar39 == 0) {
    local_1248[1] = adStack_1490[4] * dVar168 + local_1248[0];
    local_1248[2] = local_1248[0];
    local_1248[3] = dVar168 * adStack_1490[2];
    auStack_1228._0_8_ = local_1248[0];
    local_1218 = local_1248[0] - dVar52;
    uVar192 = SUB84(local_1248[0],0);
    uVar194 = (undefined4)((ulong)local_1248[0] >> 0x20);
    auVar14._8_4_ = uVar192;
    auVar14._0_8_ = local_1248[0];
    auVar14._12_4_ = uVar194;
    dStack_1200 = local_1248[0];
    local_11f8 = auVar14._8_8_;
    auVar15._8_4_ = uVar192;
    auVar15._0_8_ = local_1248[0];
    auVar15._12_4_ = uVar194;
    dStack_1210 = local_1248[0];
    local_1208 = auVar15._8_8_;
    dStack_11f0 = local_1248[0] * 0.75;
    dStack_11e8 = local_1248[0] * 1.5;
    auVar16._8_4_ = uVar192;
    auVar16._0_8_ = local_1248[0];
    auVar16._12_4_ = uVar194;
    dStack_11d0 = local_1248[0];
    dStack_11c8 = auVar16._8_8_;
    auVar17._8_4_ = uVar192;
    auVar17._0_8_ = local_1248[0];
    auVar17._12_4_ = uVar194;
    local_11e0 = local_1248[0];
    dStack_11d8 = auVar17._8_8_;
    dStack_11c0 = local_1248[0];
    local_11b8 = local_1248[0] * 1.5;
    pdVar38 = &local_1190;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      *pdVar38 = *pdVar38 - dVar52;
      pdVar38[2] = pdVar38[2] - dVar52;
      pdVar38[5] = dVar52 + pdVar38[5];
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    dVar169 = adStack_1490[4] * dVar168;
    adStack_10f0[2] = adStack_10f0[2] - dVar169;
    adStack_10f0[4] = adStack_10f0[4] - dVar169;
    adStack_10f0[7] = dVar169 + adStack_10f0[7];
    dVar168 = dVar168 * adStack_1490[2] - local_1248[0];
    adStack_10f0[0x2e] = adStack_10f0[0x2e] - dVar168;
    adStack_10f0[0x30] = adStack_10f0[0x30] - dVar168;
    adStack_10f0[0x33] = dVar168 + adStack_10f0[0x33];
    adStack_10f0[0x5a] = adStack_10f0[0x5a] + local_1248[0];
    adStack_10f0[0x5c] = adStack_10f0[0x5c] + local_1248[0];
    adStack_10f0[0x5f] = adStack_10f0[0x5f] - local_1248[0];
    adStack_10f0[0x70] = adStack_10f0[0x70] + dVar52;
    adStack_10f0[0x72] = adStack_10f0[0x72] + dVar52;
    adStack_10f0[0x75] = adStack_10f0[0x75] - dVar52;
    dVar52 = local_1248[0] * -0.25;
    local_a00 = local_a00 - dVar52;
    local_9f0 = local_9f0 - dVar52;
    local_9d8 = dVar52 + local_9d8;
    dVar52 = local_1248[0] * 0.5;
    local_950._0_8_ = (double)local_950._0_8_ - dVar52;
    local_940 = local_940 - dVar52;
    local_928 = local_928 + dVar52;
    local_530 = local_530 - dVar52;
    local_520 = local_520 - dVar52;
    local_508 = dVar52 + local_508;
    local_480 = local_480 + local_1248[0];
    local_470 = local_470 + local_1248[0];
    local_458 = local_458 - local_1248[0];
    local_3d0 = local_3d0 + local_1248[0];
    local_3c0 = local_3c0 + local_1248[0];
    local_3a8 = local_3a8 - local_1248[0];
  }
  dVar52 = adStack_1490[4] * adStack_1490[4] * adStack_1490[2];
  dVar244 = dVar52 * 1033.3424938946343 + adStack_1490[4] * adStack_1490[7] * -102.45280842339088;
  dVar210 = adStack_1490[4] * adStack_1490[4] * 1033.3424938946343;
  dVar169 = (adStack_1490[2] * 1033.3424938946343 + adStack_1490[2] * 1033.3424938946343) *
            adStack_1490[4] + adStack_1490[7] * -102.45280842339088;
  dVar170 = dVar52 * -1.1848993929991807 +
            ((((dStack_12e0 + local_12c8) - (dStack_12e0 + dStack_12e0 + dStack_12f0)) + 1.0) *
             -0.0006666666666666666 + -0.0011466666666666667) * -102.45280842339088 *
            adStack_1490[4] * adStack_1490[7];
  dVar201 = adStack_1490[4] * -102.45280842339088;
  dVar52 = adStack_1490[4] * adStack_1490[2] * adStack_1490[6];
  dVar202 = dVar52 * 36172.079901627476 + adStack_1490[7] * adStack_1490[6] * -3586.3532123502373;
  dVar52 = dVar52 * -18.327187150157922 +
           ((((dStack_12d0 + local_12c8) - (dStack_12f0 + dStack_12e0 + dStack_12d0)) + 1.0) *
            -0.0006666666666666666 + -0.0005066666666666667) * -3586.3532123502373 *
           adStack_1490[7] * adStack_1490[6];
  dVar196 = adStack_1490[4] * 36172.079901627476 * adStack_1490[6];
  dVar211 = adStack_1490[6] * adStack_1490[2] * 36172.079901627476;
  dVar168 = adStack_1490[2] * 36172.079901627476 * adStack_1490[4] +
            adStack_1490[7] * -3586.3532123502373;
  adStack_10f0[0x5a] = adStack_10f0[0x5a] - dVar168;
  adStack_10f0[0x5c] = adStack_10f0[0x5c] - dVar168;
  adStack_10f0[0x5f] = dVar168 + adStack_10f0[0x5f];
  dVar243 = adStack_1490[6] * -3586.3532123502373;
  dVar168 = adStack_1490[4] * adStack_1490[2] * adStack_1490[0x14];
  dVar124 = dVar168 * 1291.6781173682928 +
            adStack_1490[7] * adStack_1490[0x14] * -128.06601052923858;
  dVar171 = dVar168 * -1.4811242412489758 +
            ((((dStack_1260 + local_12c8) - (dStack_12f0 + dStack_12e0 + dStack_1260)) + 1.0) *
             -0.0006666666666666666 + -0.0011466666666666667) * -128.06601052923858 *
            adStack_1490[7] * adStack_1490[0x14];
  dVar245 = adStack_1490[4] * 1291.6781173682928 * adStack_1490[0x14];
  dVar172 = adStack_1490[0x14] * adStack_1490[2] * 1291.6781173682928;
  dVar212 = adStack_1490[0x14] * -128.06601052923858;
  dVar168 = adStack_1490[2] * 1291.6781173682928 * adStack_1490[4] +
            adStack_1490[7] * -128.06601052923858;
  local_480 = local_480 - dVar168;
  local_470 = local_470 - dVar168;
  local_458 = dVar168 + local_458;
  dVar168 = adStack_1490[4] * adStack_1490[2] * adStack_1490[0x15];
  dVar213 = dVar168 * 2014.7679457577242 +
            adStack_1490[7] * adStack_1490[0x15] * -199.75819787137542;
  dVar168 = dVar168 * -1.0745429044041197 +
            ((((local_1258 + local_12c8) - (dStack_12f0 + dStack_12e0 + local_1258)) + 1.0) *
             -0.0006666666666666666 + -0.0005333333333333334) * -199.75819787137542 *
            adStack_1490[7] * adStack_1490[0x15];
  adStack_1490[0x1a] = (((adStack_1490[0x1a] - dVar244) - dVar202) - dVar124) - dVar213;
  adStack_1490[0x1d] = dVar213 + dVar124 + dVar202 + dVar244 + adStack_1490[0x1d];
  dVar125 = adStack_1490[4] * 2014.7679457577242 * adStack_1490[0x15];
  adStack_10f0[2] = (((adStack_10f0[2] - dVar210) - dVar196) - dVar245) - dVar125;
  adStack_10f0[4] = (((adStack_10f0[4] - dVar210) - dVar196) - dVar245) - dVar125;
  adStack_10f0[7] = dVar125 + dVar245 + dVar196 + dVar210 + adStack_10f0[7];
  dVar196 = adStack_1490[0x15] * adStack_1490[2] * 2014.7679457577242;
  adStack_10f0[0x2e] = (((adStack_10f0[0x2e] - dVar169) - dVar211) - dVar172) - dVar196;
  adStack_10f0[0x30] = (((adStack_10f0[0x30] - dVar169) - dVar211) - dVar172) - dVar196;
  adStack_10f0[0x33] = dVar196 + dVar172 + dVar211 + dVar169 + adStack_10f0[0x33];
  dVar169 = adStack_1490[0x15] * -199.75819787137542;
  adStack_10f0[0x70] = (((adStack_10f0[0x70] - dVar201) - dVar243) - dVar212) - dVar169;
  adStack_10f0[0x72] = (((adStack_10f0[0x72] - dVar201) - dVar243) - dVar212) - dVar169;
  adStack_10f0[0x75] = dVar169 + dVar212 + dVar243 + dVar201 + adStack_10f0[0x75];
  dVar169 = adStack_1490[2] * 2014.7679457577242 * adStack_1490[4] +
            adStack_1490[7] * -199.75819787137542;
  local_3d0 = local_3d0 - dVar169;
  local_3c0 = local_3c0 - dVar169;
  local_3a8 = dVar169 + local_3a8;
  local_328[1] = ((((local_328[1] - dVar53) - dVar170) - dVar52) - dVar171) - dVar168;
  local_328[3] = ((((local_328[3] - dVar53) - dVar170) - dVar52) - dVar171) - dVar168;
  local_328[6] = dVar168 + dVar171 + dVar52 + dVar170 + dVar53 + local_328[6];
  dVar168 = adStack_1490[0x15] * -0.37 +
            adStack_1490[0x13] + adStack_1490[0x13] +
            ((((local_11a0 - adStack_1490[1]) - adStack_1490[6]) + adStack_1490[0xb]) -
            adStack_1490[0xd]);
  local_1248[2] =
       adStack_1490[2] * adStack_1490[2] * 666.6666666666666 +
       adStack_1490[1] * -1.6792101947629015e-06;
  dVar52 = local_1248[2] * dVar168;
  dVar53 = (adStack_1490[2] * adStack_1490[2] * -0.4444444444444444 +
           (((local_12f8 - (dStack_12f0 + dStack_12f0)) + 1.0) * -0.0006666666666666666 +
           -0.0006666666666666666) * -1.6792101947629015e-06 * adStack_1490[1]) * dVar168;
  adStack_1490[0x17] = adStack_1490[0x17] + dVar52;
  adStack_1490[0x18] =
       ((((adStack_1490[0x18] - dVar244) - dVar202) - dVar124) - dVar213) - (dVar52 + dVar52);
  dVar52 = dVar168 * 666.6666666666666 + dVar168 * 666.6666666666666;
  if (iVar39 == 0) {
    local_1248[0] = dVar168 * -1.6792101947629015e-06;
    local_1248[1] = dVar52 * adStack_1490[2] + local_1248[2];
    local_1248[3] = local_1248[2];
    auStack_1228._0_8_ = local_1248[2];
    local_1208 = local_1248[2];
    dStack_1200 = local_1248[2];
    local_1218 = local_1248[2];
    dStack_1210 = local_1248[2];
    local_11f8 = local_1248[2] + local_1248[2];
    dStack_11f0 = local_1248[2];
    dStack_11d0 = local_1248[2];
    dStack_11c8 = local_1248[2];
    local_11e0 = local_1248[2];
    dStack_11d8 = local_1248[2];
    dStack_11c0 = local_1248[2];
    local_11b8 = local_1248[2] * 3.0;
    local_11b0 = local_1248[2];
    local_11a8 = local_1248[2] * 0.63;
    pdVar38 = &local_1190;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-1] = pdVar38[-1] + dVar52;
      *pdVar38 = *pdVar38 - (dVar52 + dVar52);
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    dVar168 = dVar168 * -1.6792101947629015e-06 - local_1248[2];
    local_1198 = local_1198 + dVar168;
    local_1190 = local_1190 - (dVar168 + dVar168);
    dVar52 = dVar52 * adStack_1490[2];
    adStack_10f0[1] = adStack_10f0[1] + dVar52;
    adStack_10f0[2] = adStack_10f0[2] - (dVar52 + dVar52);
    adStack_10f0[0x59] = adStack_10f0[0x59] - local_1248[2];
    dVar52 = local_1248[2] + local_1248[2];
    adStack_10f0[0x5a] = adStack_10f0[0x5a] + dVar52;
    adStack_10f0[199] = adStack_10f0[199] + local_1248[2];
    local_ab0._0_8_ = (double)local_ab0._0_8_ - dVar52;
    local_958 = local_958 - local_1248[2];
    local_950._0_8_ = (double)local_950._0_8_ + dVar52;
    local_538 = local_538 + dVar52;
    local_1248[2] = local_1248[2] * -0.37;
    local_530 = local_530 - (dVar52 + dVar52);
    local_3d8 = local_3d8 + local_1248[2];
    local_3d0 = local_3d0 - (local_1248[2] + local_1248[2]);
  }
  dVar169 = adStack_1490[2] * adStack_1490[2];
  dVar52 = adStack_1490[1] * dVar169 * 1118.3757819574057 +
           adStack_1490[1] * adStack_1490[1] * -2.8169820219582113e-06;
  dVar124 = adStack_1490[1] * dVar169 * -0.4473503127829622 +
            (-0.00039999999999999996 -
            (((local_12f8 + local_12f8) - (dStack_12f0 + dStack_12f0 + local_12f8)) + 1.0) *
            0.0006666666666666666) * -2.8169820219582113e-06 * adStack_1490[1] * adStack_1490[1];
  dVar202 = dVar169 * 1118.3757819574057 + adStack_1490[1] * -5.633964043916423e-06;
  dVar168 = (adStack_1490[1] * 1118.3757819574057 + adStack_1490[1] * 1118.3757819574057) *
            adStack_1490[2];
  dVar170 = dVar169 * adStack_1490[6] * 6427.427351557215 +
            adStack_1490[1] * adStack_1490[6] * -1.618950230224919e-05;
  dVar243 = dVar169 * adStack_1490[6] * -5.356189459631012 +
            (-0.0008333333333333333 -
            (((dStack_12d0 + local_12f8) - (dStack_12f0 + dStack_12f0 + dStack_12d0)) + 1.0) *
            0.0006666666666666666) * -1.618950230224919e-05 * adStack_1490[1] * adStack_1490[6];
  dVar171 = adStack_1490[2] * 12854.85470311443 * adStack_1490[6];
  dVar196 = adStack_1490[6] * -1.618950230224919e-05;
  dVar169 = adStack_1490[2] * adStack_1490[2] * 6427.427351557215 +
            adStack_1490[1] * -1.618950230224919e-05;
  adStack_10f0[0x59] = adStack_10f0[0x59] + dVar169;
  adStack_10f0[0x5a] = adStack_10f0[0x5a] - (dVar169 + dVar169);
  dVar172 = adStack_1490[2] * adStack_1490[2] * adStack_1490[0xd];
  dVar169 = dVar172 * 244.44444444444443 +
            adStack_1490[1] * adStack_1490[0xd] * -6.157104047463972e-07;
  dVar172 = dVar172 * -0.3259259259259259 +
            (-0.0013333333333333333 -
            (((local_1298 + local_12f8) - (dStack_12f0 + dStack_12f0 + local_1298)) + 1.0) *
            0.0006666666666666666) * -6.157104047463972e-07 * adStack_1490[1] * adStack_1490[0xd];
  adStack_1490[0x17] = adStack_1490[0x17] + dVar52 + dVar170 + dVar169;
  dVar201 = adStack_1490[2] * 488.88888888888886 * adStack_1490[0xd];
  dVar125 = adStack_1490[0xd] * -6.157104047463972e-07;
  local_1198 = local_1198 + dVar202 + dVar196 + dVar125;
  local_1190 = ((local_1190 - (dVar202 + dVar202)) - (dVar196 + dVar196)) - (dVar125 + dVar125);
  adStack_10f0[1] = adStack_10f0[1] + dVar168 + dVar171 + dVar201;
  adStack_10f0[2] =
       ((adStack_10f0[2] - (dVar168 + dVar168)) - (dVar171 + dVar171)) - (dVar201 + dVar201);
  dVar168 = adStack_1490[2] * adStack_1490[2] * 244.44444444444443 +
            adStack_1490[1] * -6.157104047463972e-07;
  local_958 = local_958 + dVar168;
  local_950._0_8_ = (double)local_950._0_8_ - (dVar168 + dVar168);
  local_328[0] = local_328[0] + dVar53 + dVar124 + dVar243 + dVar172;
  local_328[1] = (((local_328[1] - (dVar53 + dVar53)) - (dVar124 + dVar124)) - (dVar243 + dVar243))
                 - (dVar172 + dVar172);
  dVar243 = adStack_1490[0x15] * -0.62 +
            adStack_1490[0x13] + adStack_1490[0x13] +
            adStack_1490[6] * 2.65 + adStack_1490[1] * -0.27 + local_11a0 + adStack_1490[0xb];
  local_1248[2] =
       adStack_1490[2] * adStack_1490[5] * 9777.777777777777 +
       adStack_1490[6] * -7.029234294042697e-07;
  dVar53 = dVar243 * local_1248[2];
  dVar168 = (adStack_1490[2] * adStack_1490[5] * -13.037037037037036 +
            (-0.0013333333333333333 -
            ((dStack_12d0 - (dStack_12f0 + local_12d8)) + 1.0) * 0.0006666666666666666) *
            -7.029234294042697e-07 * adStack_1490[6]) * dVar243;
  adStack_1490[0x18] =
       (((adStack_1490[0x18] - (dVar52 + dVar52)) - (dVar170 + dVar170)) - (dVar169 + dVar169)) -
       dVar53;
  adStack_1490[0x1b] = dVar209 - dVar53;
  adStack_1490[0x1c] = dVar53 + adStack_1490[0x1c];
  dVar52 = dVar243 * 9777.777777777777;
  if (iVar39 == 0) {
    local_1248[0] = local_1248[2] * 0.73;
    local_1248[1] = adStack_1490[5] * dVar52 + local_1248[2];
    local_1248[3] = local_1248[2];
    dVar53 = -(dVar243 * 7.029234294042697e-07) + local_1248[2] * 3.65;
    auStack_1228._8_4_ = SUB84(dVar53,0);
    auStack_1228._0_8_ = local_1248[2] + adStack_1490[2] * dVar52;
    auStack_1228._12_4_ = (int)((ulong)dVar53 >> 0x20);
    local_1208 = local_1248[2];
    dStack_1200 = local_1248[2];
    local_1218 = local_1248[2];
    dStack_1210 = local_1248[2];
    local_11f8 = local_1248[2] + local_1248[2];
    local_11e0 = local_1248[2];
    dStack_11d8 = local_1248[2];
    dStack_11f0 = local_1248[2];
    dStack_11e8 = local_1248[2];
    dStack_11d0 = local_1248[2];
    dStack_11c8 = local_1248[2];
    dStack_11c0 = local_1248[2];
    local_11b8 = local_1248[2] * 3.0;
    local_11b0 = local_1248[2];
    local_11a8 = local_1248[2] * 0.38;
    pdVar38 = &local_1170;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-4] = pdVar38[-4] - dVar52;
      pdVar38[-1] = pdVar38[-1] - dVar52;
      *pdVar38 = dVar52 + *pdVar38;
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    dVar53 = local_1248[2] * -0.27;
    local_1190 = local_1190 - dVar53;
    local_1178 = local_1178 - dVar53;
    local_1170 = dVar53 + local_1170;
    dVar53 = adStack_1490[5] * dVar52;
    adStack_10f0[2] = adStack_10f0[2] - dVar53;
    adStack_10f0[5] = adStack_10f0[5] - dVar53;
    adStack_10f0[6] = dVar53 + adStack_10f0[6];
    dVar52 = dVar52 * adStack_1490[2];
    adStack_10f0[0x44] = adStack_10f0[0x44] - dVar52;
    adStack_10f0[0x47] = adStack_10f0[0x47] - dVar52;
    adStack_10f0[0x48] = dVar52 + adStack_10f0[0x48];
    dVar52 = local_1248[2] * 2.65 - dVar243 * 7.029234294042697e-07;
    adStack_10f0[0x5a] = adStack_10f0[0x5a] - dVar52;
    adStack_10f0[0x5d] = adStack_10f0[0x5d] - dVar52;
    adStack_10f0[0x5e] = dVar52 + adStack_10f0[0x5e];
    local_ab0._0_8_ = (double)local_ab0._0_8_ - local_1248[2];
    local_a98 = local_a98 - local_1248[2];
    local_a90 = local_a90 + local_1248[2];
    dVar52 = local_1248[2] + local_1248[2];
    local_530 = local_530 - dVar52;
    local_518 = local_518 - dVar52;
    local_510 = dVar52 + local_510;
    local_1248[2] = local_1248[2] * -0.62;
    local_3d0 = local_3d0 - local_1248[2];
    local_3b8 = local_3b8 - local_1248[2];
    local_3b0 = local_1248[2] + local_3b0;
  }
  local_328[4] = local_328[4] - dVar168;
  local_328[5] = dVar168 + local_328[5];
  dVar52 = adStack_1490[6] * adStack_1490[2] * adStack_1490[0xc];
  dVar53 = adStack_1490[0xe] * adStack_1490[6] * 4989960.261382571 + dVar52 * -1002.9930150071424;
  dVar169 = adStack_1490[0xe] * adStack_1490[6] * 15645.595296379073 +
            (0.0031354148083023287 -
            (((dStack_12d0 + dStack_12f0 + dStack_12a0) - (dStack_1290 + dStack_12d0)) + -1.0) *
            0.0006666666666666666) * -1002.9930150071424 * dVar52;
  dVar52 = adStack_1490[6] * -1002.9930150071424 * adStack_1490[0xc];
  adStack_10f0[2] = adStack_10f0[2] + dVar52;
  adStack_10f0[0xc] = adStack_10f0[0xc] + dVar52;
  adStack_10f0[0xe] = adStack_10f0[0xe] - dVar52;
  dVar52 = adStack_1490[0xe] * 4989960.261382571 +
           adStack_1490[0xc] * adStack_1490[2] * -1002.9930150071424;
  adStack_10f0[0x5a] = adStack_10f0[0x5a] + dVar52;
  adStack_10f0[100] = adStack_10f0[100] + dVar52;
  adStack_10f0[0x66] = adStack_10f0[0x66] - dVar52;
  dVar52 = adStack_1490[2] * -1002.9930150071424 * adStack_1490[6];
  local_a00 = local_a00 + dVar52;
  dStack_9b0 = dStack_9b0 + dVar52;
  local_9a0 = local_9a0 - dVar52;
  dVar52 = adStack_1490[6] * 4989960.261382571;
  local_8a0 = local_8a0 + dVar52;
  dStack_850 = dStack_850 + dVar52;
  local_840 = local_840 - dVar52;
  local_328[1] = (local_328[1] - dVar168) + dVar169;
  local_328[0xb] = local_328[0xb] + dVar169;
  local_328[0xd] = local_328[0xd] - dVar169;
  dVar169 = adStack_1490[0x13] + adStack_1490[0x13] +
            adStack_1490[0xc] * 0.5 +
            ((local_11a0 + adStack_1490[1]) - adStack_1490[6]) + adStack_1490[0xb] +
            adStack_1490[0xd];
  local_1248[2] =
       adStack_1490[0xe] * 415830.02178188093 +
       adStack_1490[0xc] * adStack_1490[2] * -83.5827512505952;
  dVar52 = local_1248[2] * dVar169;
  dVar168 = (adStack_1490[0xe] * 1303.7996080315893 +
            (0.0031354148083023287 -
            (((dStack_12f0 + dStack_12a0) - dStack_1290) + -1.0) * 0.0006666666666666666) *
            -83.5827512505952 * adStack_1490[0xc] * adStack_1490[2]) * dVar169;
  adStack_1490[0x18] = adStack_1490[0x18] + dVar53 + dVar52;
  local_1388._8_8_ = (double)local_1388._8_8_ + dVar53 + dVar52;
  dStack_1370 = (dStack_1370 - dVar53) - dVar52;
  dVar52 = dVar169 * 415830.02178188093;
  dVar169 = dVar169 * 83.5827512505952;
  if (iVar39 == 0) {
    local_1248[0] = local_1248[2] + local_1248[2];
    local_1248[1] = local_1248[2] - adStack_1490[0xc] * dVar169;
    local_1248[3] = local_1248[2];
    auStack_1228._0_8_ = local_1248[2];
    uVar192 = SUB84(local_1248[2],0);
    uVar194 = (undefined4)((ulong)local_1248[2] >> 0x20);
    auVar10._8_4_ = uVar192;
    auVar10._0_8_ = local_1248[2];
    auVar10._12_4_ = uVar194;
    local_1208 = local_1248[2];
    dStack_1200 = auVar10._8_8_;
    auVar11._8_4_ = uVar192;
    auVar11._0_8_ = local_1248[2];
    auVar11._12_4_ = uVar194;
    local_1218 = local_1248[2];
    dStack_1210 = auVar11._8_8_;
    local_11f8 = local_1248[0];
    dStack_11f0 = local_1248[2] * 1.5 - dVar169 * adStack_1490[2];
    dStack_11e8 = local_1248[0];
    local_11e0 = dVar52 + local_1248[2];
    auVar12._8_4_ = uVar192;
    auVar12._0_8_ = local_1248[2];
    auVar12._12_4_ = uVar194;
    dStack_11c8 = local_1248[2];
    dStack_11c0 = auVar12._8_8_;
    auVar13._8_4_ = uVar192;
    auVar13._0_8_ = local_1248[2];
    auVar13._12_4_ = uVar194;
    dStack_11d8 = local_1248[2];
    dStack_11d0 = auVar13._8_8_;
    local_11b8 = local_1248[2] * 3.0;
    local_11b0 = local_1248[2];
    local_11a8 = local_1248[2];
    pdVar38 = &local_1130;
    lVar36 = 0;
    do {
      dVar52 = local_1248[lVar36];
      pdVar38[-0xc] = pdVar38[-0xc] + dVar52;
      pdVar38[-2] = pdVar38[-2] + dVar52;
      *pdVar38 = *pdVar38 - dVar52;
      lVar36 = lVar36 + 1;
      pdVar38 = pdVar38 + 0x16;
    } while (lVar36 != 0x15);
  }
  else {
    local_1190 = local_1190 + local_1248[2];
    local_1140 = local_1140 + local_1248[2];
    local_1130 = local_1130 - local_1248[2];
    dVar53 = -dVar169 * adStack_1490[0xc];
    adStack_10f0[2] = adStack_10f0[2] + dVar53;
    adStack_10f0[0xe] = adStack_10f0[0xe] - dVar53;
    adStack_10f0[0xc] = dVar53 + adStack_10f0[0xc];
    adStack_10f0[0x5a] = adStack_10f0[0x5a] - local_1248[2];
    adStack_10f0[100] = adStack_10f0[100] - local_1248[2];
    adStack_10f0[0x66] = adStack_10f0[0x66] + local_1248[2];
    local_ab0._0_8_ = (double)local_ab0._0_8_ + local_1248[2];
    dStack_a60 = dStack_a60 + local_1248[2];
    local_a50 = local_a50 - local_1248[2];
    dVar53 = local_1248[2] * 0.5 - dVar169 * adStack_1490[2];
    local_a00 = local_a00 + dVar53;
    dStack_9b0 = dStack_9b0 + dVar53;
    local_9a0 = local_9a0 - dVar53;
    local_950._0_8_ = (double)local_950._0_8_ + local_1248[2];
    local_900 = local_900 + local_1248[2];
    local_8f0 = local_8f0 - local_1248[2];
    local_8a0 = local_8a0 + dVar52;
    dStack_850 = dStack_850 + dVar52;
    local_840 = local_840 - dVar52;
    local_1248[2] = local_1248[2] + local_1248[2];
    local_530 = local_530 + local_1248[2];
    local_4e0 = local_4e0 + local_1248[2];
    local_4d0 = local_4d0 - local_1248[2];
  }
  dVar197 = adStack_1490[1] * adStack_1490[3] * 1831069.794862108 +
            adStack_1490[2] * adStack_1490[5] * -1587014.959464585;
  dVar126 = adStack_1490[1] * adStack_1490[3] * 5835.198557030137 +
            (0.0031867701457385282 -
            ((dStack_12f0 + local_12d8) - (local_12f8 + local_12e8)) * 0.0006666666666666666) *
            -1587014.959464585 * adStack_1490[2] * adStack_1490[5];
  dVar203 = adStack_1490[3] * 1831069.794862108;
  dStack_1188 = dStack_1188 - dVar203;
  dVar54 = adStack_1490[5] * -1587014.959464585;
  dVar52 = adStack_1490[1] * 1831069.794862108;
  adStack_10f0[0x17] = adStack_10f0[0x17] - dVar52;
  dVar173 = adStack_1490[2] * -1587014.959464585;
  dVar305 = adStack_1490[7] * 20000000.0;
  adStack_10f0[0x1d] = adStack_10f0[0x1d] - dVar305;
  dVar311 = adStack_1490[5] * -0.44037520695372745;
  dVar306 = adStack_1490[4] * -0.44037520695372745;
  dVar198 = adStack_1490[3] * 20000000.0;
  adStack_10f0[0x71] = adStack_10f0[0x71] - dVar198;
  dVar55 = adStack_1490[0xe] * -2.787694465907913e-05;
  dVar297 = adStack_1490[3] * adStack_1490[8] * 0.0 +
            (0.0 - ((dStack_1290 + dStack_12f0) - (dStack_12c0 + local_12e8)) *
                   0.0006666666666666666) * -2.787694465907913e-05 *
            adStack_1490[2] * adStack_1490[0xe];
  dVar303 = adStack_1490[7] * adStack_1490[3] * 0.0 +
            (0.0 - ((local_12d8 + dStack_12e0) - (local_12e8 + local_12c8)) * 0.0006666666666666666)
            * -0.44037520695372745 * adStack_1490[5] * adStack_1490[4];
  dVar53 = adStack_1490[3] * adStack_1490[8] * 80000000.0 +
           adStack_1490[2] * adStack_1490[0xe] * -2.787694465907913e-05;
  dVar209 = adStack_1490[7] * adStack_1490[3] * 20000000.0 +
            adStack_1490[5] * adStack_1490[4] * -0.44037520695372745;
  dVar127 = adStack_1490[8] * 80000000.0;
  adStack_10f0[0x1e] = adStack_10f0[0x1e] - dVar127;
  dVar56 = adStack_1490[3] * 80000000.0;
  adStack_10f0[0x87] = adStack_10f0[0x87] - dVar56;
  dVar312 = adStack_1490[2] * -2.787694465907913e-05;
  dVar28 = ((adStack_1490[0x19] - dVar197) - dVar209) - dVar53;
  adStack_1490[0x1a] = dVar209 + adStack_1490[0x1a];
  auVar3._8_4_ = SUB84(adStack_1490[0x1a],0);
  auVar3._0_8_ = dVar28;
  auVar3._12_4_ = (int)((ulong)adStack_1490[0x1a] >> 0x20);
  adStack_1490[0x1d] = adStack_1490[0x1d] - dVar209;
  auVar4._8_4_ = SUB84(adStack_1490[0x1e] - dVar53,0);
  auVar4._0_8_ = adStack_1490[0x1d];
  auVar4._12_4_ = (int)((ulong)(adStack_1490[0x1e] - dVar53) >> 0x20);
  dVar57 = adStack_1490[0xe] * -1.2126178147109573e-07;
  dVar128 = adStack_1490[9] * 15000000.0;
  adStack_10f0[0x1f] = adStack_10f0[0x1f] - dVar128;
  dVar58 = adStack_1490[3] * 15000000.0;
  adStack_10f0[0x9d] = adStack_10f0[0x9d] - dVar58;
  dVar124 = adStack_1490[2] * -1.2126178147109573e-07;
  adStack_10f0[0xa8] = dVar58 + adStack_10f0[0xa8];
  local_868 = local_868 - dVar124;
  dVar59 = adStack_1490[0xf] * -0.12993945039280527;
  dVar29 = adStack_1490[3] * adStack_1490[9] * 0.0 +
           (0.0 - ((dStack_12f0 + dStack_1290) - (local_12e8 + local_12b8)) * 0.0006666666666666666)
           * -1.2126178147109573e-07 * adStack_1490[0xe] * adStack_1490[2];
  dVar35 = adStack_1490[10] * adStack_1490[3] * 0.0 +
           (0.0 - ((local_1288 + dStack_12f0) - (dStack_12b0 + local_12e8)) * 0.0006666666666666666)
           * -0.12993945039280527 * adStack_1490[2] * adStack_1490[0xf];
  dVar129 = adStack_1490[10] * 84300000.0;
  dVar60 = adStack_1490[3] * 84300000.0;
  dVar298 = adStack_1490[2] * -0.12993945039280527;
  dVar246 = adStack_1490[3] * adStack_1490[9] * 15000000.0 +
            adStack_1490[0xe] * adStack_1490[2] * -1.2126178147109573e-07;
  dVar266 = adStack_1490[10] * adStack_1490[3] * 84300000.0 +
            adStack_1490[2] * adStack_1490[0xf] * -0.12993945039280527;
  adStack_1490[0x1a] = auVar3._8_8_;
  dVar61 = adStack_1490[0xb] * 3309407.0851908242;
  adStack_10f0[0x21] = adStack_10f0[0x21] - dVar61;
  dVar130 = adStack_1490[10] * -141857.17388911778;
  dVar62 = adStack_1490[5] * -141857.17388911778;
  dVar199 = adStack_1490[3] * 3309407.0851908242;
  dVar63 = adStack_1490[0xe] * 30000000.0;
  dVar278 = adStack_1490[0xb] * adStack_1490[3] * 9674.740273245088 +
            (0.002923405922631374 -
            ((local_12d8 + dStack_12b0) - (local_12e8 + local_12a8)) * 0.0006666666666666666) *
            -141857.17388911778 * adStack_1490[5] * adStack_1490[10];
  dVar288 = adStack_1490[3] * adStack_1490[0xe] * 0.0 +
            (0.0 - ((dStack_12a0 + local_12d8) - (dStack_1290 + local_12e8)) * 0.0006666666666666666
            ) * -1.316420144391347e-05 * adStack_1490[0xc] * adStack_1490[5];
  dVar64 = adStack_1490[0xc] * -1.316420144391347e-05;
  dVar131 = adStack_1490[5] * -1.316420144391347e-05;
  dVar132 = adStack_1490[3] * 30000000.0;
  dVar214 = adStack_1490[0xb] * adStack_1490[3] * 3309407.0851908242 +
            adStack_1490[5] * adStack_1490[10] * -141857.17388911778;
  dVar236 = adStack_1490[3] * adStack_1490[0xe] * 30000000.0 +
            adStack_1490[0xc] * adStack_1490[5] * -1.316420144391347e-05;
  dVar174 = adStack_1490[3] * adStack_1490[0xe] * 30000000.0 +
            adStack_1490[2] * adStack_1490[0xd] * -9.717850050148037e-07;
  dVar215 = adStack_1490[3] * adStack_1490[0xe] * 0.0 +
            (0.0 - ((dStack_12f0 + local_1298) - (local_12e8 + dStack_1290)) * 0.0006666666666666666
            ) * -9.717850050148037e-07 * adStack_1490[2] * adStack_1490[0xd];
  dVar65 = adStack_1490[0xd] * -9.717850050148037e-07;
  dVar66 = adStack_1490[0xe] * 30000000.0;
  dVar247 = adStack_1490[2] * -9.717850050148037e-07;
  local_8f0 = local_8f0 - dVar247;
  dVar67 = adStack_1490[3] * 30000000.0;
  local_848 = local_848 + dVar67;
  dVar175 = adStack_1490[3] * adStack_1490[0xf] * 11893241.704910735 +
            adStack_1490[5] * adStack_1490[0xe] * -2811.709768791155;
  dVar216 = adStack_1490[3] * adStack_1490[0xf] * 9416.207166531589 +
            (0.0007917275541994261 -
            ((local_12d8 + dStack_1290) - (local_12e8 + local_1288)) * 0.0006666666666666666) *
            -2811.709768791155 * adStack_1490[5] * adStack_1490[0xe];
  dVar68 = adStack_1490[0xf] * 11893241.704910735;
  dVar69 = adStack_1490[0xe] * -2811.709768791155;
  dVar125 = adStack_1490[5] * -2811.709768791155;
  dVar248 = adStack_1490[3] * 11893241.704910735;
  dVar70 = adStack_1490[0x11] * 11574309.207109384;
  adStack_10f0[0x24] =
       (((dVar128 + dVar127 + adStack_10f0[0x24]) - dVar63) - dVar66) + dVar68 + dVar70;
  adStack_10f0[0x27] = adStack_10f0[0x27] - dVar70;
  dVar133 = adStack_1490[0xe] * -14.898178128775022;
  dVar71 = adStack_1490[10] * -14.898178128775022;
  local_898 = (((((local_898 - dVar312) - dVar124) - dVar132) - dVar67) - dVar125) - dVar71;
  local_828 = local_828 - dVar71;
  dVar30 = adStack_1490[3] * 11574309.207109384;
  local_688 = local_688 - dVar30;
  local_630 = local_630 + dVar30;
  dVar72 = adStack_1490[0x12] * 132000000.0;
  dVar279 = adStack_1490[0x11] * adStack_1490[3] * 14690.152683074684 +
            (0.0012692034073231281 -
            ((dStack_12b0 + dStack_1290) - (local_12e8 + local_1278)) * 0.0006666666666666666) *
            -14.898178128775022 * adStack_1490[10] * adStack_1490[0xe];
  dVar289 = adStack_1490[3] * adStack_1490[0x12] * 0.0 +
            (0.0 - ((local_1288 + dStack_12b0) - (dStack_1270 + local_12e8)) * 0.0006666666666666666
            ) * -0.00037751521951089154 * adStack_1490[0xf] * adStack_1490[10];
  adStack_10f0[0x25] = ((dVar129 + adStack_10f0[0x25]) - dVar68) + dVar72;
  dVar73 = adStack_1490[0xf] * -0.00037751521951089154;
  dVar134 = adStack_1490[10] * -0.00037751521951089154;
  local_7e8 = ((local_7e8 - dVar298) - dVar248) - dVar134;
  local_770 = local_770 - dVar134;
  dVar313 = adStack_1490[3] * 132000000.0;
  local_578 = local_578 + dVar313;
  dVar217 = adStack_1490[0x11] * adStack_1490[3] * 11574309.207109384 +
            adStack_1490[10] * adStack_1490[0xe] * -14.898178128775022;
  dVar237 = adStack_1490[3] * adStack_1490[0x12] * 132000000.0 +
            adStack_1490[0xf] * adStack_1490[10] * -0.00037751521951089154;
  dVar176 = adStack_1490[3] * adStack_1490[0x13] * 16686316.432824839 +
            adStack_1490[5] * adStack_1490[0x12] * -64695.71318864056;
  dVar218 = adStack_1490[3] * adStack_1490[0x13] * 42593.141495423035 +
            (0.00255257903485727 -
            ((local_12d8 + dStack_1270) - (local_12e8 + local_1268)) * 0.0006666666666666666) *
            -64695.71318864056 * adStack_1490[5] * adStack_1490[0x12];
  dVar74 = adStack_1490[0x13] * 16686316.432824839;
  adStack_10f0[0x28] = (adStack_10f0[0x28] - dVar72) + dVar74;
  adStack_10f0[0x29] = adStack_10f0[0x29] - dVar74;
  dVar75 = adStack_1490[0x12] * -64695.71318864056;
  dVar31 = adStack_1490[5] * -64695.71318864056;
  local_5d8 = (local_5d8 - dVar313) - dVar31;
  dVar170 = adStack_1490[3] * 16686316.432824839;
  dStack_528 = dStack_528 - dVar170;
  dVar76 = adStack_1490[0xd] * -0.32764529688590877;
  adStack_10f0[0x22] = (adStack_10f0[0x22] + dVar63) - dVar76;
  adStack_10f0[0x23] = dVar76 + adStack_10f0[0x23] + dVar66;
  dVar135 = adStack_1490[0xc] * 0.2714339464219018;
  adStack_10f0[0x39] = dVar135 + adStack_10f0[0x39];
  dVar77 = adStack_1490[4] * 0.2714339464219018;
  dStack_9f8 = (dStack_9f8 - dVar131) + dVar77;
  dVar249 = adStack_1490[3] * -0.32764529688590877;
  local_940 = local_940 - dVar249;
  dVar323 = adStack_1490[0xf] * 148.64629960980085;
  dVar136 = adStack_1490[0xe] * -1595994.8383312945;
  dVar78 = adStack_1490[7] * -1595994.8383312945;
  dVar250 = adStack_1490[4] * 148.64629960980085;
  dVar280 = adStack_1490[4] * adStack_1490[0xc] * 0.002901780483165377 +
            (0.01069055850020694 -
            ((local_12e8 + local_1298) - (dStack_12e0 + dStack_12a0)) * 0.0006666666666666666) *
            -0.32764529688590877 * adStack_1490[3] * adStack_1490[0xd];
  dVar290 = adStack_1490[0xf] * adStack_1490[4] * 1.3298008048685055 +
            (0.008946074058750577 -
            ((local_12c8 + dStack_1290) - (local_1288 + dStack_12e0)) * 0.0006666666666666666) *
            -1595994.8383312945 * adStack_1490[7] * adStack_1490[0xe];
  dVar171 = adStack_1490[4] * adStack_1490[0xc] * 0.2714339464219018 +
            adStack_1490[3] * adStack_1490[0xd] * -0.32764529688590877;
  dVar23 = adStack_1490[0xf] * adStack_1490[4] * 148.64629960980085 +
           adStack_1490[7] * adStack_1490[0xe] * -1595994.8383312945;
  adStack_1490[0x1e] = auVar4._8_8_;
  dVar299 = adStack_1490[4] * 659416.0587695736;
  adStack_10f0[3] = dVar299 + (((((adStack_10f0[3] - dVar54) - dVar55) - dVar57) - dVar59) - dVar65)
  ;
  dVar137 = adStack_1490[5] * -10782603.17894348;
  dVar281 = adStack_1490[2] * 659416.0587695736;
  adStack_10f0[0x18] =
       (adStack_10f0[0x18] + dVar52 + dVar127 + dVar128 + dVar129 + dVar66) - dVar137;
  dVar79 = adStack_1490[3] * -10782603.17894348;
  dVar138 = adStack_1490[4] * -0.4971315070618765;
  local_1180 = local_1180 + dVar138;
  local_1168 = local_1168 - dVar138;
  dVar177 = adStack_1490[7] * 19568365.243600544;
  dVar324 = adStack_1490[1] * -0.4971315070618765;
  adStack_10f0[0x2d] = adStack_10f0[0x2d] + dVar324;
  dVar139 = adStack_1490[2] * 19568365.243600544;
  adStack_10f0[0x6f] = adStack_10f0[0x6f] + dVar139;
  dVar80 = adStack_1490[2] * adStack_1490[7] * 4674.103192900765 +
           (0.00023886017736864045 -
           ((dStack_12e0 + local_12f8) - (local_12c8 + dStack_12f0)) * 0.0006666666666666666) *
           -0.4971315070618765 * adStack_1490[4] * adStack_1490[1];
  dVar123 = adStack_1490[4] * adStack_1490[2] * 2125.623798113147 +
            (0.0032234941352193023 -
            ((local_12e8 + local_12d8) - (dStack_12f0 + dStack_12e0)) * 0.0006666666666666666) *
            -10782603.17894348 * adStack_1490[3] * adStack_1490[5];
  dVar201 = adStack_1490[2] * adStack_1490[7] * 19568365.243600544 +
            adStack_1490[4] * adStack_1490[1] * -0.4971315070618765;
  dVar24 = adStack_1490[4] * adStack_1490[2] * 659416.0587695736 +
           adStack_1490[3] * adStack_1490[5] * -10782603.17894348;
  dVar178 = adStack_1490[2] * adStack_1490[7] * 108289848.15442011 +
            adStack_1490[5] * adStack_1490[5] * -38.98923487337139;
  dVar219 = adStack_1490[2] * adStack_1490[7] * 15379.207897229715 +
            (0.00014201892568266544 -
            ((local_12d8 + local_12d8) - (dStack_12f0 + local_12c8)) * 0.0006666666666666666) *
            -38.98923487337139 * adStack_1490[5] * adStack_1490[5];
  dVar140 = adStack_1490[7] * 108289848.15442011;
  adStack_10f0[7] = (adStack_10f0[7] - dVar177) - dVar140;
  dVar141 = adStack_1490[5] * -77.97846974674277;
  dVar81 = adStack_1490[2] * 108289848.15442011;
  adStack_10f0[0x70] = (adStack_10f0[0x70] - dVar139) - dVar81;
  dVar142 = adStack_1490[10] * -120140.80184495587;
  local_1148 = local_1148 - dVar142;
  dVar143 = adStack_1490[0xb] * 2429212.6664140443;
  adStack_10f0[0xb] = adStack_10f0[0xb] - dVar143;
  dVar82 = adStack_1490[1] * -120140.80184495587;
  dVar202 = adStack_1490[2] * 2429212.6664140443;
  adStack_10f0[199] = adStack_10f0[199] + dVar202;
  local_ab0._8_8_ = (double)local_ab0._8_8_ - dVar199;
  local_ab0._0_8_ = (double)local_ab0._0_8_ - dVar202;
  dVar83 = adStack_1490[0xc] * -3.716149717925534e-05;
  dVar282 = adStack_1490[2] * adStack_1490[0xb] * 8512.899029058015 +
            (0.003504386069921407 -
            ((local_12f8 + dStack_12b0) - (dStack_12f0 + local_12a8)) * 0.0006666666666666666) *
            -120140.80184495587 * adStack_1490[10] * adStack_1490[1];
  dVar291 = adStack_1490[0xe] * adStack_1490[2] * 0.0 +
            (0.0 - ((dStack_12a0 + local_12f8) - (dStack_1290 + dStack_12f0)) *
                   0.0006666666666666666) * -3.716149717925534e-05 *
            adStack_1490[1] * adStack_1490[0xc];
  local_1140 = local_1140 + dVar83;
  dVar144 = adStack_1490[0xe] * 73400000.0;
  dVar314 = adStack_1490[1] * -3.716149717925534e-05;
  local_a08 = local_a08 + dVar314;
  dVar84 = adStack_1490[2] * 73400000.0;
  dVar220 = adStack_1490[2] * adStack_1490[0xb] * 2429212.6664140443 +
            adStack_1490[10] * adStack_1490[1] * -120140.80184495587;
  dVar238 = adStack_1490[0xe] * adStack_1490[2] * 73400000.0 +
            adStack_1490[1] * adStack_1490[0xc] * -3.716149717925534e-05;
  dVar145 = adStack_1490[2] * adStack_1490[0xf] * 16575581.576889673 +
            adStack_1490[1] * adStack_1490[0xe] * -4521.295558798051;
  dVar221 = adStack_1490[2] * adStack_1490[0xf] * 23743.85449528333 +
            (0.0014324598135602037 -
            ((local_12f8 + dStack_1290) - (dStack_12f0 + local_1288)) * 0.0006666666666666666) *
            -4521.295558798051 * adStack_1490[1] * adStack_1490[0xe];
  dVar85 = adStack_1490[0xe] * -4521.295558798051;
  local_1130 = (local_1130 - dVar83) + dVar85;
  local_1128 = local_1128 - dVar85;
  dVar86 = adStack_1490[0xf] * 16575581.576889673;
  adStack_10f0[0xe] = (((dVar57 + dVar55 + adStack_10f0[0xe]) - dVar65) - dVar144) + dVar86;
  dVar210 = adStack_1490[1] * -4521.295558798051;
  local_8a8 = local_8a8 + dVar84 + dVar210;
  local_8a0 = ((local_8a0 + dVar312 + dVar124 + dVar67) - dVar84) - dVar210;
  dVar251 = adStack_1490[2] * 16575581.576889673;
  local_7f8 = local_7f8 + dVar251;
  dVar179 = adStack_1490[2] * adStack_1490[0x10] * 32000000.0 +
            adStack_1490[5] * adStack_1490[10] * -10291.734087429853;
  dVar222 = adStack_1490[2] * adStack_1490[0x10] * 0.0 +
            (0.0 - ((local_12d8 + dStack_12b0) - (dStack_12f0 + dStack_1280)) *
                   0.0006666666666666666) * -10291.734087429853 * adStack_1490[5] * adStack_1490[10]
  ;
  dVar87 = adStack_1490[0x10] * 32000000.0;
  adStack_10f0[0x10] = adStack_10f0[0x10] - dVar87;
  dVar88 = adStack_1490[10] * -10291.734087429853;
  dVar211 = adStack_1490[5] * -10291.734087429853;
  dVar252 = adStack_1490[2] * 32000000.0;
  local_740 = local_740 - dVar252;
  dVar146 = adStack_1490[2] * adStack_1490[0x13] * 9958163.265843963 +
            adStack_1490[1] * adStack_1490[0x12] * -44546.96801065157;
  dVar223 = adStack_1490[2] * adStack_1490[0x13] * 29384.200706874846 +
            (0.0029507651082264627 -
            ((local_12f8 + dStack_1270) - (dStack_12f0 + local_1268)) * 0.0006666666666666666) *
            -44546.96801065157 * adStack_1490[1] * adStack_1490[0x12];
  dVar89 = adStack_1490[0x12] * -44546.96801065157;
  local_1110 = local_1110 + dVar89;
  local_1108[0] = local_1108[0] - dVar89;
  dVar90 = adStack_1490[0x13] * 9958163.265843963;
  adStack_10f0[0x13] = adStack_10f0[0x13] - dVar90;
  dVar212 = adStack_1490[1] * -44546.96801065157;
  local_5e8 = local_5e8 + dVar212;
  dVar253 = adStack_1490[2] * 9958163.265843963;
  local_538 = local_538 + dVar253;
  local_530 = local_530 - dVar253;
  dVar254 = adStack_1490[1] * adStack_1490[5] * 4271828.084344627 +
            adStack_1490[2] * adStack_1490[6] * -121922.904977942;
  dVar224 = adStack_1490[1] * adStack_1490[5] * 7577.3366907946565 +
            (0.0017737925172045287 -
            ((dStack_12f0 + dStack_12d0) - (local_12f8 + local_12d8)) * 0.0006666666666666666) *
            -121922.904977942 * adStack_1490[2] * adStack_1490[6];
  dVar91 = adStack_1490[5] * 4271828.084344627;
  local_1178 = (dVar203 + local_1178) - dVar91;
  local_1170 = dVar91 + local_1170;
  dVar92 = adStack_1490[6] * -121922.904977942;
  adStack_10f0[6] = dVar92 + adStack_10f0[6];
  dVar32 = adStack_1490[1] * 4271828.084344627;
  adStack_10f0[0x43] = (adStack_10f0[0x43] - dVar173) - dVar32;
  dVar196 = adStack_1490[2] * -121922.904977942;
  adStack_10f0[0x59] = adStack_10f0[0x59] - dVar196;
  adStack_10f0[0x5a] = adStack_10f0[0x5a] + dVar196;
  dVar255 = adStack_1490[5] * adStack_1490[5] * 3038827.9270273494 +
            adStack_1490[3] * adStack_1490[6] * -100069.45216403608;
  dVar225 = adStack_1490[5] * adStack_1490[5] * 3428.0853547552383 +
            (0.0011280945934009068 -
            ((local_12e8 + dStack_12d0) - (local_12d8 + local_12d8)) * 0.0006666666666666666) *
            -100069.45216403608 * adStack_1490[3] * adStack_1490[6];
  dVar147 = adStack_1490[6] * -100069.45216403608;
  adStack_10f0[0x1b] =
       (dVar305 + dVar52 + adStack_10f0[0x1b] + dVar61 + dVar63 + dVar68 + dVar74 + dVar137) -
       (dVar147 + dVar147);
  adStack_10f0[0x1c] = dVar147 + adStack_10f0[0x1c];
  dVar148 = adStack_1490[5] * 6077655.854054699;
  adStack_10f0[0x45] =
       dVar79 + ((((((adStack_10f0[0x45] - dVar173) - dVar306) - dVar130) - dVar64) - dVar69) -
                dVar75) + dVar148;
  dVar213 = adStack_1490[3] * -100069.45216403608;
  adStack_10f0[0x5b] = adStack_10f0[0x5b] + dVar213;
  dVar300 = adStack_1490[6] * -0.024867627282709664;
  dVar180 = adStack_1490[7] * 34296205.4093863;
  dVar307 = dVar148 + dVar32 + adStack_10f0[0x48] + dVar180;
  dVar169 = ((adStack_10f0[0x49] - dVar306) - dVar141) - dVar180;
  auVar5._8_4_ = SUB84(dVar169,0);
  auVar5._0_8_ = dVar307;
  auVar5._12_4_ = (int)((ulong)dVar169 >> 0x20);
  dVar33 = adStack_1490[4] * -0.024867627282709664;
  adStack_10f0[0x5f] = adStack_10f0[0x5f] - dVar33;
  dVar149 = adStack_1490[5] * 34296205.4093863;
  adStack_10f0[0x74] = adStack_10f0[0x74] + dVar149;
  dVar120 = adStack_1490[0xf] * -0.029479148639814108;
  dVar325 = adStack_1490[8] * adStack_1490[5] * 20000000.0 +
            adStack_1490[0xf] * adStack_1490[2] * -0.029479148639814108;
  dVar327 = adStack_1490[5] * adStack_1490[7] * 34296205.4093863 +
            adStack_1490[6] * adStack_1490[4] * -0.024867627282709664;
  dVar150 = adStack_1490[8] * 20000000.0;
  dVar151 = adStack_1490[5] * 20000000.0;
  dVar315 = adStack_1490[2] * -0.029479148639814108;
  dVar319 = adStack_1490[8] * adStack_1490[5] * 0.0 +
            (0.0 - ((local_1288 + dStack_12f0) - (dStack_12c0 + local_12d8)) * 0.0006666666666666666
            ) * -0.029479148639814108 * adStack_1490[0xf] * adStack_1490[2];
  dVar322 = adStack_1490[5] * adStack_1490[7] * -3835.2049190811504 +
            (-0.00011182592573438223 -
            ((dStack_12d0 + dStack_12e0) - (local_12d8 + local_12c8)) * 0.0006666666666666666) *
            -0.024867627282709664 * adStack_1490[6] * adStack_1490[4];
  dVar169 = (((adStack_1490[0x1d] + dVar23) - dVar201) - dVar178) - dVar327;
  auVar6._8_4_ = SUB84(adStack_1490[0x1e] - dVar325,0);
  auVar6._0_8_ = dVar169;
  auVar6._12_4_ = (int)((ulong)(adStack_1490[0x1e] - dVar325) >> 0x20);
  dVar152 = adStack_1490[0xf] * -0.001025849604117461;
  adStack_10f0[0xf] = dVar152 + dVar120 + ((dVar59 + adStack_10f0[0xf]) - dVar86);
  dVar153 = adStack_1490[9] * 30000000.0;
  dVar154 = adStack_1490[5] * 30000000.0;
  dVar226 = adStack_1490[2] * -0.001025849604117461;
  local_7f0 = ((local_7f0 + dVar298) - dVar251) + dVar315 + dVar226;
  dVar93 = adStack_1490[10] * 1097137.153737377;
  dVar283 = adStack_1490[10] * adStack_1490[5] * 2500.221646810261 +
            (0.00227885970162737 -
            ((dStack_12c0 + dStack_12d0) - (dStack_12b0 + local_12d8)) * 0.0006666666666666666) *
            -37781.99143773652 * adStack_1490[8] * adStack_1490[6];
  dVar292 = adStack_1490[5] * adStack_1490[9] * 0.0 +
            (0.0 - ((local_1288 + dStack_12f0) - (local_12d8 + local_12b8)) * 0.0006666666666666666)
            * -0.001025849604117461 * adStack_1490[0xf] * adStack_1490[2];
  dVar256 = adStack_1490[10] * adStack_1490[5] * 1097137.153737377 +
            adStack_1490[8] * adStack_1490[6] * -37781.99143773652;
  dVar267 = adStack_1490[5] * adStack_1490[9] * 30000000.0 +
            adStack_1490[0xf] * adStack_1490[2] * -0.001025849604117461;
  adStack_10f0[0x49] = auVar5._8_8_;
  dVar155 = adStack_1490[8] * -37781.99143773652;
  dVar94 = adStack_1490[6] * -37781.99143773652;
  adStack_10f0[0x8a] = adStack_10f0[0x8a] + dVar94;
  dVar308 = adStack_1490[5] * 1097137.153737377;
  adStack_1490[0x1e] = auVar6._8_8_;
  dVar181 = adStack_1490[5] * adStack_1490[10] * 25010000.0 +
            adStack_1490[6] * adStack_1490[9] * -37124457.44676649;
  dVar227 = adStack_1490[5] * adStack_1490[10] * 0.0 +
            (0.0 - ((dStack_12d0 + local_12b8) - (local_12d8 + dStack_12b0)) * 0.0006666666666666666
            ) * -37124457.44676649 * adStack_1490[6] * adStack_1490[9];
  dVar95 = adStack_1490[10] * 25010000.0;
  dVar96 = adStack_1490[9] * -37124457.44676649;
  dVar244 = adStack_1490[6] * -37124457.44676649;
  dVar257 = adStack_1490[5] * 25010000.0;
  dVar156 = adStack_1490[0xb] * 4238127.66170656;
  adStack_10f0[0x4d] = (adStack_10f0[0x4d] - dVar130) - dVar156;
  dVar157 = adStack_1490[10] * -5982.3326554224905;
  adStack_10f0[0x62] = ((adStack_10f0[0x62] - dVar155) - dVar96) + dVar157;
  adStack_10f0[99] = adStack_10f0[99] - dVar157;
  dVar182 = adStack_1490[6] * -5982.3326554224905;
  adStack_10f0[0xb6] = adStack_10f0[0xb6] + dVar308 + dVar257 + dVar182;
  dVar258 = adStack_1490[5] * 4238127.66170656;
  local_a98 = (local_a98 + dVar199) - dVar258;
  local_a90 = local_a90 + dVar258;
  dVar97 = adStack_1490[0xd] * -27278.71839873273;
  dVar259 = adStack_1490[5] * adStack_1490[0xc] * 308.3061146970958 +
            (0.0008343222962694802 -
            ((local_1298 + dStack_12f0) - (dStack_12a0 + local_12d8)) * 0.0006666666666666666) *
            -27278.71839873273 * adStack_1490[0xd] * adStack_1490[2];
  dVar268 = adStack_1490[0xb] * adStack_1490[5] * 7478.008612521503 +
            (0.0017644604432492119 -
            ((dStack_12b0 + dStack_12d0) - (local_12d8 + local_12a8)) * 0.0006666666666666666) *
            -5982.3326554224905 * adStack_1490[10] * adStack_1490[6];
  dVar228 = adStack_1490[5] * adStack_1490[0xc] * 369528.79729527823 +
            adStack_1490[0xd] * adStack_1490[2] * -27278.71839873273;
  dVar239 = adStack_1490[0xb] * adStack_1490[5] * 4238127.66170656 +
            adStack_1490[10] * adStack_1490[6] * -5982.3326554224905;
  adStack_10f0[0xd] = dVar97 + adStack_10f0[0xd] + dVar65;
  dVar183 = adStack_1490[0xc] * 369528.79729527823;
  dVar158 = adStack_1490[5] * 369528.79729527823;
  dVar301 = adStack_1490[2] * -27278.71839873273;
  local_950._8_8_ = ((double)local_950._8_8_ - dVar247) + dVar249;
  local_950._0_8_ = (double)local_950._0_8_ + dVar247 + dVar301;
  dVar98 = adStack_1490[0xe] * 50000000.0;
  dVar99 = adStack_1490[0xc] * -7.225013822780462e-07;
  dVar159 = adStack_1490[6] * -7.225013822780462e-07;
  dVar245 = adStack_1490[5] * 50000000.0;
  dVar316 = (((((((((dVar178 + dVar178 +
                     dVar209 + dVar197 + adStack_1490[0x1b] + dVar214 + dVar236 + dVar175 + dVar176
                     + dVar24 + dVar179) - dVar254) - (dVar255 + dVar255)) - dVar327) - dVar325) -
               dVar267) - dVar256) - dVar181) - dVar239) - dVar228;
  dVar209 = dVar327 + dVar254 + adStack_1490[0x1c] + dVar255 + dVar256 + dVar181 + dVar239;
  dVar284 = adStack_1490[5] * adStack_1490[0xf] * 22295026.02480445 +
            adStack_1490[0xe] * adStack_1490[6] * -173.56959160214726;
  dVar293 = adStack_1490[0xe] * adStack_1490[5] * 50000000.0 +
            adStack_1490[6] * adStack_1490[0xc] * -7.225013822780462e-07;
  auVar26._8_4_ = SUB84(dVar209,0);
  auVar26._0_8_ = dVar316;
  auVar26._12_4_ = (int)((ulong)dVar209 >> 0x20);
  dVar160 = adStack_1490[0xf] * 22295026.02480445;
  dVar184 = adStack_1490[0xe] * -173.56959160214726;
  adStack_10f0[0x66] = (adStack_10f0[0x66] - dVar99) + dVar184;
  adStack_10f0[0x67] = adStack_10f0[0x67] - dVar184;
  dVar161 = adStack_1490[6] * -173.56959160214726;
  local_880 = local_880 + dVar245 + dVar161;
  dVar229 = adStack_1490[5] * 22295026.02480445;
  local_7d0 = local_7d0 + dVar229;
  dVar302 = adStack_1490[5] * adStack_1490[0xf] * 15309.867045680163 +
            (0.0006866942890601289 -
            ((dStack_1290 + dStack_12d0) - (local_1288 + local_12d8)) * 0.0006666666666666666) *
            -173.56959160214726 * adStack_1490[0xe] * adStack_1490[6];
  dVar304 = adStack_1490[0xe] * adStack_1490[5] * 0.0 +
            (0.0 - ((dStack_12d0 + dStack_12a0) - (local_12d8 + dStack_1290)) *
                   0.0006666666666666666) * -7.225013822780462e-07 *
            adStack_1490[6] * adStack_1490[0xc];
  dVar209 = dVar304 + ((dVar291 + ((dVar288 + local_328[0xb] + dVar168) - dVar280)) - dVar259);
  dVar243 = dVar259 + local_328[0xc] + dVar215 + dVar280;
  auVar7._8_4_ = SUB84(dVar243,0);
  auVar7._0_8_ = dVar209;
  auVar7._12_4_ = (int)((ulong)dVar243 >> 0x20);
  adStack_1490[0x1c] = auVar26._8_8_;
  dVar100 = adStack_1490[0x13] * 14307411.985466668;
  adStack_10f0[0x54] = adStack_10f0[0x54] + dVar75 + dVar100;
  adStack_10f0[0x55] = (adStack_10f0[0x55] - dVar75) - dVar100;
  dVar162 = adStack_1490[0x12] * -1826.7180743084757;
  adStack_10f0[0x5d] =
       ((((((((adStack_10f0[0x5d] - dVar196) - (dVar213 + dVar213)) - dVar33) - dVar155) - dVar96) -
         dVar157) - dVar99) - dVar184) - dVar162;
  adStack_10f0[0x6a] = adStack_10f0[0x6a] + dVar162;
  adStack_10f0[0x6b] = adStack_10f0[0x6b] - dVar162;
  dVar101 = adStack_1490[6] * -1826.7180743084757;
  local_5c8 = (local_5c8 + dVar31) - dVar101;
  local_5c0 = local_5c0 + dVar101;
  dVar260 = adStack_1490[5] * 14307411.985466668;
  local_518 = (local_518 + dVar170) - dVar260;
  local_510 = local_510 + dVar260;
  dVar185 = adStack_1490[0xf] * -1.061382456225949e-08;
  dVar186 = adStack_1490[8] * 20000000.0;
  adStack_10f0[0x76] = adStack_10f0[0x76] - dVar186;
  dVar187 = adStack_1490[7] * 20000000.0;
  adStack_10f0[0x8b] = adStack_10f0[0x8b] - dVar187;
  dVar320 = adStack_1490[5] * -1.061382456225949e-08;
  adStack_10f0[0x93] = dVar187 + dVar151 + adStack_10f0[0x93];
  dStack_7c0 = (dStack_7c0 - dVar315) - dVar320;
  dVar261 = adStack_1490[8] * adStack_1490[7] * 0.0 +
            (0.0 - ((local_1288 + local_12d8) - (dStack_12c0 + local_12c8)) * 0.0006666666666666666)
            * -1.061382456225949e-08 * adStack_1490[0xf] * adStack_1490[5];
  dVar269 = adStack_1490[0x13] * adStack_1490[5] * 23005.037159633022 +
            (0.0016079104441111584 -
            ((dStack_1270 + dStack_12d0) - (local_1268 + local_12d8)) * 0.0006666666666666666) *
            -1826.7180743084757 * adStack_1490[0x12] * adStack_1490[6];
  dVar230 = adStack_1490[8] * adStack_1490[7] * 20000000.0 +
            adStack_1490[0xf] * adStack_1490[5] * -1.061382456225949e-08;
  dVar240 = adStack_1490[0x13] * adStack_1490[5] * 14307411.985466668 +
            adStack_1490[0x12] * adStack_1490[6] * -1826.7180743084757;
  dVar102 = adStack_1490[0xb] * -0.5136789314491079;
  adStack_10f0[0x37] = dVar102 + adStack_10f0[0x37];
  dVar163 = adStack_1490[10] * 1000000.0;
  dVar103 = adStack_1490[7] * 1000000.0;
  adStack_10f0[0x79] = dVar163 + adStack_10f0[0x79];
  dVar121 = adStack_1490[4] * -0.5136789314491079;
  local_aa0 = local_aa0 + dVar121;
  local_a88 = local_a88 - dVar121;
  dVar104 = adStack_1490[0x10] * -22389.705712050265;
  adStack_10f0[0x52] = dVar104 + (adStack_10f0[0x52] - dVar88);
  dVar105 = adStack_1490[10] * 20000000.0;
  adStack_10f0[0x78] = (adStack_10f0[0x78] - dVar163) - dVar105;
  dVar204 = adStack_1490[7] * 20000000.0;
  adStack_10f0[0xb7] = (adStack_10f0[0xb7] - dVar103) - dVar204;
  dVar326 = adStack_1490[5] * -22389.705712050265;
  local_728 = local_728 + dVar252 + dVar326;
  dVar309 = adStack_1490[10] * adStack_1490[7] * 0.0 +
            (0.0 - ((local_12d8 + dStack_1280) - (dStack_12b0 + local_12c8)) * 0.0006666666666666666
            ) * -22389.705712050265 * adStack_1490[5] * adStack_1490[0x10];
  dVar310 = adStack_1490[7] * adStack_1490[10] * 0.0 +
            (0.0 - ((dStack_12e0 + local_12a8) - (local_12c8 + dStack_12b0)) * 0.0006666666666666666
            ) * -0.5136789314491079 * adStack_1490[4] * adStack_1490[0xb];
  dVar243 = ((((((local_328[6] - dVar303) + dVar290) - dVar80) - dVar219) - dVar322) - dVar261) -
            dVar310;
  dVar172 = (((local_328[7] - dVar297) - dVar319) + dVar283) - dVar261;
  auVar8._8_4_ = SUB84(dVar172,0);
  auVar8._0_8_ = dVar243;
  auVar8._12_4_ = (int)((ulong)dVar172 >> 0x20);
  dVar22 = adStack_1490[10] * adStack_1490[7] * 20000000.0 +
           adStack_1490[5] * adStack_1490[0x10] * -22389.705712050265;
  dVar25 = adStack_1490[7] * adStack_1490[10] * 1000000.0 +
           adStack_1490[4] * adStack_1490[0xb] * -0.5136789314491079;
  dVar169 = (dVar169 - dVar230) - dVar25;
  dVar172 = (adStack_1490[0x1e] + dVar256) - dVar230;
  auVar9._8_4_ = SUB84(dVar172,0);
  auVar9._0_8_ = dVar169;
  auVar9._12_4_ = (int)((ulong)dVar172 >> 0x20);
  adStack_1490[0x1e] = auVar9._8_8_;
  local_328[7] = auVar8._8_8_;
  dVar106 = adStack_1490[0xd] * -0.001452763170659347;
  adStack_10f0[0x49] = ((adStack_10f0[0x49] - dVar185) - dVar104) - dVar106;
  adStack_10f0[0x48] = dVar307 + dVar93 + dVar95 + dVar156 + dVar98 + dVar160 + dVar100;
  adStack_10f0[0x4f] = dVar106 + dVar183 + adStack_10f0[0x4f];
  dVar164 = adStack_1490[0xc] * 54659.06262097068;
  adStack_10f0[0x73] =
       ((dVar81 + dVar81 + dVar198 + adStack_10f0[0x73]) - dVar149) + dVar186 + dVar105 + dVar164;
  adStack_10f0[0x7b] = dVar164 + adStack_10f0[0x7b];
  dVar107 = adStack_1490[7] * 54659.06262097068;
  dVar118 = adStack_1490[5] * -0.001452763170659347;
  local_938 = (local_938 - dVar301) + dVar118;
  local_928 = local_928 - dVar118;
  dVar108 = adStack_1490[8] * 7980492.798776164;
  dVar285 = adStack_1490[7] * adStack_1490[0xc] * 288.5005730915626 +
            (0.005278183694662841 -
            ((local_12d8 + local_1298) - (dStack_12a0 + local_12c8)) * 0.0006666666666666666) *
            -0.001452763170659347 * adStack_1490[5] * adStack_1490[0xd];
  dVar294 = adStack_1490[4] * adStack_1490[8] * 2677.2779851191463 +
            (0.00033547777720314666 -
            ((dStack_1290 + local_12d8) - (dStack_12c0 + dStack_12e0)) * 0.0006666666666666666) *
            -4.547251755334367e-05 * adStack_1490[0xe] * adStack_1490[5];
  adStack_10f0[0x34] = adStack_10f0[0x34] - dVar108;
  dVar165 = adStack_1490[0xe] * -4.547251755334367e-05;
  adStack_10f0[0x4a] = (((adStack_10f0[0x4a] - dVar150) + dVar93) - dVar185) - dVar165;
  adStack_10f0[0x50] = dVar165 + (((adStack_10f0[0x50] - dVar64) + dVar69) - dVar98) + dVar160;
  dVar317 = adStack_1490[4] * 7980492.798776164;
  adStack_10f0[0x88] = adStack_10f0[0x88] - dVar317;
  adStack_10f0[0x89] = ((adStack_10f0[0x89] - dVar151) - dVar94) + dVar187 + dVar317;
  dVar321 = adStack_1490[5] * -4.547251755334367e-05;
  adStack_10f0[0x92] = dVar317 + dVar56 + adStack_10f0[0x92];
  local_888 = (((local_888 + dVar132 + dVar125) - dVar245) - dVar161) + dVar321;
  local_870 = (local_870 - dVar312) - dVar321;
  dVar231 = adStack_1490[7] * adStack_1490[0xc] * 54659.06262097068 +
            adStack_1490[5] * adStack_1490[0xd] * -0.001452763170659347;
  dVar241 = adStack_1490[4] * adStack_1490[8] * 7980492.798776164 +
            adStack_1490[0xe] * adStack_1490[5] * -4.547251755334367e-05;
  local_328[0xc] = auVar7._8_8_;
  dVar232 = adStack_1490[1] * adStack_1490[8] * 99487.69671959426 +
            adStack_1490[2] * adStack_1490[10] * -82454.99861437384;
  dVar205 = adStack_1490[1] * adStack_1490[8] * 293.5221550217246 +
            (0.0029503362194525 -
            ((dStack_12f0 + dStack_12b0) - (local_12f8 + dStack_12c0)) * 0.0006666666666666666) *
            -82454.99861437384 * adStack_1490[2] * adStack_1490[10];
  dVar109 = adStack_1490[8] * 99487.69671959426;
  local_1160 = local_1160 - dVar109;
  dVar110 = adStack_1490[10] * -82454.99861437384;
  dVar307 = adStack_1490[1] * 99487.69671959426;
  adStack_10f0[0x85] = adStack_10f0[0x85] - dVar307;
  dVar262 = adStack_1490[2] * -82454.99861437384;
  dVar111 = adStack_1490[0x11] * -10.82871927173647;
  adStack_10f0[8] = (((adStack_10f0[8] - dVar55) - dVar120) - dVar110) - dVar111;
  dVar166 = adStack_1490[10] * 40000000.0;
  adStack_10f0[0x86] = adStack_10f0[0x86] + dVar56 + dVar151 + dVar307 + dVar166;
  adStack_10f0[0x95] = dVar166 + adStack_10f0[0x95];
  dVar112 = adStack_1490[8] * 40000000.0;
  dVar34 = adStack_1490[2] * -10.82871927173647;
  local_660 = local_660 - dVar34;
  dVar113 = adStack_1490[0xb] * 345311.0578145205;
  dVar286 = adStack_1490[10] * adStack_1490[8] * 0.0 +
            (0.0 - ((dStack_12f0 + local_1278) - (dStack_12c0 + dStack_12b0)) *
                   0.0006666666666666666) * -10.82871927173647 *
            adStack_1490[0x11] * adStack_1490[2];
  dVar295 = adStack_1490[8] * adStack_1490[0xb] * 1099.1023565570054 +
            (0.003182934144980015 -
            ((dStack_12b0 + dStack_12b0) - (dStack_12c0 + local_12a8)) * 0.0006666666666666666) *
            -14154.126978189057 * adStack_1490[10] * adStack_1490[10];
  adStack_10f0[0x8e] = dVar113 + dVar113 + ((dVar307 + (adStack_10f0[0x8e] - dVar94)) - dVar166);
  dVar114 = adStack_1490[10] * -28308.253956378114;
  adStack_10f0[0x8f] = adStack_10f0[0x8f] - dVar113;
  adStack_10f0[0xb8] = (((adStack_10f0[0xb8] + dVar308) - dVar262) - dVar112) - dVar114;
  dVar318 = adStack_1490[8] * 345311.0578145205;
  local_a80 = local_a80 - dVar318;
  dVar233 = adStack_1490[10] * adStack_1490[8] * 40000000.0 +
            adStack_1490[0x11] * adStack_1490[2] * -10.82871927173647;
  dVar242 = adStack_1490[8] * adStack_1490[0xb] * 345311.0578145205 +
            adStack_1490[10] * adStack_1490[10] * -14154.126978189057;
  dVar188 = adStack_1490[9] * adStack_1490[0x14] * 12265169.958139507 +
            adStack_1490[0x14] * adStack_1490[8] * -284545.07285187626;
  dVar263 = adStack_1490[9] * adStack_1490[0x14] * 1645.8767818301812 +
            (0.00013419111088125866 -
            ((dStack_1260 + dStack_12c0) - (local_12b8 + dStack_1260)) * 0.0006666666666666666) *
            -284545.07285187626 * adStack_1490[0x14] * adStack_1490[8];
  dVar172 = adStack_1490[9] * 12265169.958139507 + adStack_1490[8] * -284545.07285187626;
  local_450 = local_450 + dVar172;
  local_448 = local_448 - dVar172;
  dVar189 = adStack_1490[9] * adStack_1490[0x15] * 7359101.974883704 +
            adStack_1490[0x15] * adStack_1490[8] * -170727.04371112576;
  dVar264 = adStack_1490[9] * adStack_1490[0x15] * 987.5260690981088 +
            (0.00013419111088125866 -
            ((local_1258 + dStack_12c0) - (local_12b8 + local_1258)) * 0.0006666666666666666) *
            -170727.04371112576 * adStack_1490[0x15] * adStack_1490[8];
  dVar172 = adStack_1490[9] * 7359101.974883704 + adStack_1490[8] * -170727.04371112576;
  local_3a0 = local_3a0 + dVar172;
  local_398 = local_398 - dVar172;
  dVar172 = adStack_1490[2] * adStack_1490[5] * adStack_1490[0xc];
  dVar234 = adStack_1490[4] * adStack_1490[9] * 28000000.0 + dVar172 * -7.439703734094493e-10;
  local_11a0 = dVar241 + (((dVar316 - dVar293) - dVar284) - dVar240) + dVar230 + dVar22 + dVar231 +
               dVar234;
  dVar115 = adStack_1490[5] * -7.439703734094493e-10 * adStack_1490[0xc];
  adStack_10f0[4] = ((adStack_10f0[4] - dVar299) + dVar177) - dVar115;
  adStack_10f0[5] =
       (((((dVar140 + dVar140 + dVar54 + adStack_10f0[5] + dVar299 + dVar87) - dVar92) - dVar120) -
        dVar152) - dVar97) + dVar115;
  adStack_10f0[0xc] = dVar115 + ((adStack_10f0[0xc] + dVar144) - dVar97);
  dVar116 = adStack_1490[9] * 28000000.0;
  adStack_10f0[0x2e] = ((adStack_10f0[0x2e] - dVar281) - dVar324) + dVar116;
  dVar167 = adStack_1490[2] * -7.439703734094493e-10 * adStack_1490[0xc];
  adStack_10f0[0x44] =
       ((((adStack_10f0[0x44] + dVar173) - dVar79) - dVar141) - dVar88) + dVar32 + dVar150 + dVar153
       + dVar183 + dVar167;
  adStack_10f0[0x4b] = ((adStack_10f0[0x4b] - dVar153) + dVar95) - dVar167;
  adStack_10f0[0x4e] = dVar167 + ((((adStack_10f0[0x4e] + dVar64) - dVar183) + dVar98) - dVar106);
  dVar119 = adStack_1490[4] * 28000000.0;
  adStack_10f0[0x9f] = ((adStack_10f0[0x9f] - dVar154) - dVar244) + dVar119;
  dVar316 = adStack_1490[2] * -7.439703734094493e-10 * adStack_1490[5];
  local_a00 = (local_a00 - dVar314) + dVar158 + dVar316;
  local_9e8 = (((local_9e8 + dVar131) - dVar158) - dVar159) + dVar107 + dVar316;
  dVar206 = adStack_1490[4] * adStack_1490[9] * 0.0 +
            (0.0 - (((dStack_12f0 + local_12d8 + dStack_12a0) - (dStack_12e0 + local_12b8)) + -1.0)
                   * 0.0006666666666666666) * -7.439703734094493e-10 * dVar172;
  dVar190 = adStack_1490[4] * adStack_1490[9] * 12000000.0 +
            adStack_1490[6] * adStack_1490[0xc] * -2.2921694105207742e-20;
  dVar207 = adStack_1490[4] * adStack_1490[9] * 0.0 +
            (0.0 - ((dStack_12d0 + dStack_12a0) - (dStack_12e0 + local_12b8)) *
                   0.0006666666666666666) * -2.2921694105207742e-20 *
            adStack_1490[6] * adStack_1490[0xc];
  dVar117 = adStack_1490[9] * 12000000.0;
  adStack_10f0[0x32] = adStack_10f0[0x32] + dVar300 + dVar117;
  adStack_10f0[0x35] = (adStack_10f0[0x35] - dVar116) - dVar117;
  dVar172 = adStack_1490[0xc] * -2.2921694105207742e-20;
  adStack_10f0[0x5c] = (dVar33 + adStack_10f0[0x5c]) - dVar172;
  adStack_10f0[0x5e] =
       dVar213 + dVar196 + adStack_10f0[0x5e] + dVar33 + dVar155 + dVar96 + dVar157 + dVar99 +
       dVar184 + dVar162 + dVar172;
  adStack_10f0[100] = dVar172 + adStack_10f0[100] + dVar99;
  dVar265 = adStack_1490[4] * 12000000.0;
  adStack_10f0[0x9e] = (adStack_10f0[0x9e] - dVar119) - dVar265;
  adStack_10f0[0xa0] = adStack_10f0[0xa0] + dVar244 + dVar265;
  dVar235 = adStack_1490[6] * -2.2921694105207742e-20;
  local_9e0 = local_9e0 + dVar159 + dVar235;
  local_328[5] = dVar322 + dVar224 + local_328[5] + dVar225 + dVar283 + dVar227 + dVar268 + dVar304
                 + dVar302 + dVar269 + dVar207;
  dVar196 = adStack_1490[9] * 70000000.0;
  local_1198 = ((((local_1198 - dVar203) + dVar138 + dVar142 + dVar83 + dVar85 + dVar89) - dVar91) -
               dVar109) - dVar196;
  local_1190 = ((((((local_1190 + dVar203) - dVar138) - dVar142) - dVar83) - dVar85) - dVar89) +
               dVar91 + dVar109 + dVar196;
  local_1158 = local_1158 - dVar196;
  local_1150 = dVar196 + dVar109 + local_1150 + dVar142;
  dVar191 = adStack_1490[10] * -1345932.1015318723;
  adStack_10f0[1] =
       ((((adStack_10f0[1] - dVar54) + dVar177 + dVar143 + dVar144 + dVar86 + dVar90) - dVar92) -
       dVar110) - dVar191;
  dVar91 = adStack_1490[1] * 70000000.0;
  adStack_10f0[0x9b] = adStack_10f0[0x9b] - dVar91;
  dVar157 = adStack_1490[2] * -1345932.1015318723;
  adStack_10f0[0xb1] = ((adStack_10f0[0xb1] + dVar82) - dVar262) - dVar157;
  dVar196 = adStack_1490[9] * 30000000.0 + adStack_1490[8] * -695983.1958864406;
  dVar99 = adStack_1490[6] * adStack_1490[9] * 0.0 +
           (0.0 - ((dStack_12d0 + dStack_12c0) - (dStack_12d0 + local_12b8)) * 0.0006666666666666666
           ) * -695983.1958864406 * adStack_1490[6] * adStack_1490[8];
  dVar109 = adStack_1490[9] * adStack_1490[1] * 0.0 +
            (0.0 - ((dStack_12b0 + dStack_12f0) - (local_12f8 + local_12b8)) * 0.0006666666666666666
            ) * -1345932.1015318723 * adStack_1490[2] * adStack_1490[10];
  dVar213 = adStack_1490[6] * adStack_1490[9] * 30000000.0 +
            adStack_1490[6] * adStack_1490[8] * -695983.1958864406;
  dVar85 = adStack_1490[9] * adStack_1490[1] * 70000000.0 +
           adStack_1490[2] * adStack_1490[10] * -1345932.1015318723;
  adStack_10f0[0x60] = adStack_10f0[0x60] + dVar155 + dVar196;
  adStack_10f0[0x61] = ((adStack_10f0[0x61] + dVar96) - dVar172) - dVar196;
  local_328[0] = ((((local_328[0] - dVar126) + dVar80 + dVar282 + dVar291 + dVar221 + dVar223) -
                  dVar224) - dVar205) - dVar109;
  adStack_1490[0x17] =
       ((((adStack_1490[0x17] - dVar197) + dVar201 + dVar220 + dVar238 + dVar145 + dVar146) -
        dVar254) - dVar232) - dVar85;
  dVar155 = ((((((((adStack_1490[0x1f] - dVar246) - dVar267) + dVar181) - dVar188) - dVar189) -
              dVar234) - dVar190) - dVar85) - dVar213;
  dVar172 = dVar85 + dVar242 + dVar242 +
                     ((dVar232 +
                      (((dVar239 +
                        (((dVar237 + (adStack_1490[0x20] - dVar266) + dVar214 + dVar217 + dVar220 +
                          dVar179) - dVar256) - dVar181)) - dVar25) - dVar22)) - dVar233);
  auVar21._8_4_ = SUB84(dVar172,0);
  auVar21._0_8_ = dVar155;
  auVar21._12_4_ = (int)((ulong)dVar172 >> 0x20);
  dVar162 = ((((((((local_328[8] - dVar29) - dVar292) + dVar227) - dVar263) - dVar264) - dVar206) -
             dVar207) - dVar109) - dVar99;
  dVar172 = dVar109 + dVar295 + dVar295 +
                      ((dVar205 +
                       ((((((dVar289 + (local_328[9] - dVar35) + dVar278 + dVar279 + dVar282 +
                            dVar222) - dVar283) - dVar227) + dVar268) - dVar310) - dVar309)) -
                      dVar286);
  auVar27._8_4_ = SUB84(dVar172,0);
  auVar27._0_8_ = dVar162;
  auVar27._12_4_ = (int)((ulong)dVar172 >> 0x20);
  dVar96 = adStack_1490[0x11] * -0.09124785266815053;
  adStack_10f0[9] = ((((adStack_10f0[9] - dVar57) - dVar152) - dVar115) - dVar191) - dVar96;
  adStack_10f0[0x11] = dVar96 + dVar111 + adStack_10f0[0x11];
  dVar181 = adStack_1490[10] * 14528743.285075013;
  adStack_10f0[0x9c] = adStack_10f0[0x9c] + dVar58 + dVar154 + dVar119 + dVar91 + dVar181;
  adStack_10f0[0xab] = dVar181 + adStack_10f0[0xab];
  dVar138 = adStack_1490[9] * 14528743.285075013;
  dVar33 = adStack_1490[2] * -0.09124785266815053;
  adStack_10f0[0xc1] = dVar138 + dVar112 + (adStack_10f0[0xc1] - dVar133);
  local_690 = local_690 + dVar34 + dVar33;
  local_658 = local_658 - dVar33;
  dStack_650 = ((dStack_650 + dVar30) - dVar34) - dVar33;
  dVar184 = adStack_1490[0xb] * 19371657.71343335;
  adStack_10f0[0xa4] = dVar184 + dVar184 + ((dVar91 + (adStack_10f0[0xa4] - dVar244)) - dVar181);
  dVar203 = adStack_1490[10] * -36842.31259623495;
  adStack_10f0[0xa5] = adStack_10f0[0xa5] - dVar184;
  adStack_10f0[0xb9] = (((adStack_10f0[0xb9] + dVar257) - dVar157) - dVar138) - dVar203;
  dVar142 = adStack_1490[9] * 19371657.71343335;
  local_a78 = local_a78 - dVar142;
  dVar287 = adStack_1490[0xb] * adStack_1490[9] * -2469.529054768268 +
            (-0.00012748155533719572 -
            ((dStack_12b0 + dStack_12b0) - (local_12b8 + local_12a8)) * 0.0006666666666666666) *
            -18421.156298117476 * adStack_1490[10] * adStack_1490[10];
  dVar296 = adStack_1490[9] * adStack_1490[10] * -1852.146791076201 +
            (-0.00012748155533719572 -
            ((dStack_12f0 + local_1278) - (local_12b8 + dStack_12b0)) * 0.0006666666666666666) *
            -0.09124785266815053 * adStack_1490[0x11] * adStack_1490[2];
  local_328[9] = auVar27._8_8_;
  dVar83 = adStack_1490[0xb] * adStack_1490[9] * 19371657.71343335 +
           adStack_1490[10] * adStack_1490[10] * -18421.156298117476;
  dVar89 = adStack_1490[9] * adStack_1490[10] * 14528743.285075013 +
           adStack_1490[0x11] * adStack_1490[2] * -0.09124785266815053;
  adStack_1490[0x20] = auVar21._8_8_;
  dVar172 = adStack_1490[9] * adStack_1490[0xc] * 9000000.0 +
            adStack_1490[0xc] * adStack_1490[8] * -208794.958765932;
  dVar256 = adStack_1490[9] * adStack_1490[0xc] * 0.0 +
            (0.0 - ((dStack_12a0 + dStack_12c0) - (local_12b8 + dStack_12a0)) *
                   0.0006666666666666666) * -208794.958765932 * adStack_1490[0xc] * adStack_1490[8];
  dVar208 = adStack_1490[9] * 9000000.0 + adStack_1490[8] * -208794.958765932;
  local_9d0 = local_9d0 + dVar208;
  dVar196 = adStack_1490[9] * adStack_1490[0xd] * 7000000.0 +
            adStack_1490[0xd] * adStack_1490[8] * -162396.0790401699;
  dVar200 = adStack_1490[9] * adStack_1490[0xd] * 0.0 +
            (0.0 - ((local_1298 + dStack_12c0) - (local_12b8 + local_1298)) * 0.0006666666666666666)
            * -162396.0790401699 * adStack_1490[0xd] * adStack_1490[8];
  adStack_10f0[0x8c] =
       ((((((((adStack_10f0[0x8c] - dVar56) - dVar151) + dVar94) - dVar187) - dVar317) - dVar307) -
        dVar166) - dVar113) + adStack_1490[0x14] * -284545.07285187626 +
       adStack_1490[0x15] * -170727.04371112576 + adStack_1490[6] * -695983.1958864406 +
       adStack_1490[0xc] * -208794.958765932 + adStack_1490[0xd] * -162396.0790401699;
  adStack_10f0[0x8d] =
       ((((adStack_10f0[0x8d] - adStack_1490[0x14] * -284545.07285187626) -
         adStack_1490[0x15] * -170727.04371112576) - adStack_1490[6] * -695983.1958864406) -
       adStack_1490[0xc] * -208794.958765932) - adStack_1490[0xd] * -162396.0790401699;
  adStack_10f0[0xa2] =
       adStack_10f0[0xa2] + adStack_1490[0x14] * 12265169.958139507 +
       adStack_1490[0x15] * 7359101.974883704 + adStack_1490[6] * 30000000.0 +
       adStack_1490[0xc] * 9000000.0 + adStack_1490[0xd] * 7000000.0;
  dVar56 = adStack_1490[9] * 7000000.0 + adStack_1490[8] * -162396.0790401699;
  local_920 = local_920 + dVar56;
  dVar307 = adStack_1490[0xd] * 14000000.0;
  adStack_10f0[0xa3] =
       (((((((((((((adStack_10f0[0xa3] - dVar58) - dVar154) + dVar244) -
                adStack_1490[0x14] * 12265169.958139507) - adStack_1490[0x15] * 7359101.974883704) -
              dVar119) - dVar265) - dVar91) - adStack_1490[6] * 30000000.0) - dVar181) - dVar184) -
        adStack_1490[0xc] * 9000000.0) - adStack_1490[0xd] * 7000000.0) - dVar307;
  adStack_10f0[0xa6] = dVar265 + dVar119 + adStack_10f0[0xa6] + dVar307;
  adStack_10f0[0xa7] = adStack_10f0[0xa7] - dVar307;
  adStack_10f0[0xa9] = dVar307 + dVar154 + adStack_10f0[0xa9];
  dVar58 = adStack_1490[0xf] * -0.006485071999156734;
  local_9c8 = (((local_9c8 - dVar316) - dVar235) - dVar208) - dVar58;
  local_9a8 = (dVar107 + dVar158 + dVar77 + local_9a8) - dVar58;
  dVar244 = adStack_1490[9] * 14000000.0;
  local_998 = dVar58 + local_998;
  local_918 = (local_918 - dVar56) - dVar244;
  local_900 = (((local_900 - dVar249) - dVar301) - dVar118) + dVar244;
  local_8f8 = (dVar118 + dVar301 + dVar249 + local_8f8 + dVar247) - dVar244;
  local_8e8 = dVar244 + local_8e8;
  dVar94 = adStack_1490[0xc] * -0.006485071999156734;
  local_7b8 = (local_7b8 - dVar226) - dVar94;
  local_7a0 = local_7a0 + dVar94;
  local_798 = local_798 - dVar94;
  dVar244 = adStack_1490[0x10] * -86596485.19199125;
  adStack_10f0[0x19] =
       dVar137 + ((((((((((((adStack_10f0[0x19] - dVar52) - dVar305) - dVar127) - dVar128) - dVar129
                        ) - dVar61) - dVar63) - dVar66) - dVar68) - dVar70) - dVar72) - dVar74) +
                 dVar76 + dVar147 + dVar244;
  adStack_10f0[0x1a] = (((dVar305 + adStack_10f0[0x1a]) - dVar76) - dVar137) - dVar244;
  adStack_10f0[0x20] = ((adStack_10f0[0x20] - dVar129) + dVar61 + dVar70 + dVar72) - dVar244;
  adStack_10f0[0x26] = dVar244 + adStack_10f0[0x26];
  dVar61 = adStack_1490[10] * 1703.2356556327686;
  adStack_10f0[0x2f] = dVar281 + (adStack_10f0[0x2f] - dVar311) + dVar135 + dVar61;
  dVar118 = adStack_1490[4] * 1703.2356556327686;
  adStack_10f0[0xb3] = ((((adStack_10f0[0xb3] - dVar60) - dVar62) - dVar133) - dVar73) + dVar118;
  adStack_10f0[0xc0] = dVar118 + dVar204 + (adStack_10f0[0xc0] - dVar211);
  dVar76 = adStack_1490[3] * -86596485.19199125;
  local_738 = local_738 + dVar76;
  local_700 = ((local_700 + dVar252) - dVar326) - dVar76;
  dVar119 = adStack_1490[0xd] * adStack_1490[9] * 0.0 +
            (0.0 - ((dStack_12a0 + local_1288) - (local_1298 + local_12b8)) * 0.0006666666666666666)
            * -0.006485071999156734 * adStack_1490[0xc] * adStack_1490[0xf];
  dVar56 = adStack_1490[10] * adStack_1490[4] * 10.970836066652648 +
           (0.006441173322300416 -
           ((local_12e8 + dStack_1280) - (dStack_12b0 + dStack_12e0)) * 0.0006666666666666666) *
           -86596485.19199125 * adStack_1490[3] * adStack_1490[0x10];
  dVar63 = adStack_1490[0xd] * adStack_1490[9] * 14000000.0 +
           adStack_1490[0xc] * adStack_1490[0xf] * -0.006485071999156734;
  dVar66 = adStack_1490[10] * adStack_1490[4] * 1703.2356556327686 +
           adStack_1490[3] * adStack_1490[0x10] * -86596485.19199125;
  local_1378 = (dVar231 + dVar228 + local_1378 + dVar174 + dVar171) - dVar63;
  local_328[2] = dVar225 + ((((((((((((local_328[2] - dVar126) - dVar303) - dVar297) - dVar29) -
                                  dVar35) - dVar278) - dVar288) - dVar215) - dVar216) - dVar279) -
                            dVar289) - dVar218) + dVar280 + dVar123 + dVar56;
  dVar244 = adStack_1490[10] * 1793.8203338395704;
  adStack_10f0[0x31] =
       ((dVar311 + adStack_10f0[0x31] + dVar281) - dVar300) + dVar108 + dVar116 + dVar244;
  adStack_10f0[0x36] = ((adStack_10f0[0x36] - dVar102) - dVar61) - dVar244;
  dVar52 = adStack_1490[0xf] * -4.52122891906719e-05;
  adStack_10f0[0x46] =
       (((dVar180 + ((dVar306 + adStack_10f0[0x46]) - dVar79)) - dVar165) - dVar167) - dVar52;
  adStack_10f0[0x47] =
       (((((((((((((dVar141 + dVar141 +
                    dVar306 + dVar173 + adStack_10f0[0x47] + dVar130 + dVar64 + dVar69 + dVar75 +
                    dVar79 + dVar88) - dVar32) - (dVar148 + dVar148)) - dVar180) - dVar150) -
              dVar153) - dVar93) - dVar95) - dVar156) - dVar183) - dVar98) - dVar160) - dVar100) +
       dVar185 + dVar104 + dVar106 + dVar165 + dVar167 + dVar52;
  adStack_10f0[0x4c] =
       (((((adStack_10f0[0x4c] + dVar130 + dVar88) - dVar93) - dVar95) + dVar156) - dVar104) -
       dVar52;
  dVar74 = adStack_1490[4] * 1793.8203338395704;
  adStack_10f0[0x51] =
       dVar52 + dVar185 + ((dVar153 + dVar150 + (adStack_10f0[0x51] - dVar69)) - dVar160);
  adStack_10f0[0xb4] = ((adStack_10f0[0xb4] + dVar103) - dVar118) - dVar74;
  adStack_10f0[0xb5] =
       ((((adStack_10f0[0xb5] + dVar62 + dVar211) - dVar308) - dVar257) - dVar182) + dVar204 +
       dVar74;
  dVar91 = adStack_1490[5] * -4.52122891906719e-05;
  local_7d8 = ((((local_7d8 + dVar248) - dVar315) - dVar226) - dVar229) + dVar320 + dVar91;
  dVar307 = adStack_1490[10] * adStack_1490[10] * 296026.4442752242 +
            adStack_1490[2] * adStack_1490[0x12] * -159545083.58041438;
  dVar32 = adStack_1490[10] * adStack_1490[10] * 721.5278371512255 +
           (0.00243737629223557 -
           ((dStack_12f0 + dStack_1270) - (dStack_12b0 + dStack_12b0)) * 0.0006666666666666666) *
           -159545083.58041438 * adStack_1490[2] * adStack_1490[0x12];
  adStack_1490[0x18] =
       (((((((((adStack_1490[0x18] + dVar197 + dVar53 + dVar246 + dVar266 + dVar174) - dVar24) -
             dVar201) - dVar178) - dVar220) - dVar238) - dVar145) - dVar179) - dVar146) + dVar254 +
       dVar325 + dVar267 + dVar228 + dVar232 + dVar233 + dVar234 + dVar85 + dVar89 + dVar307;
  dVar52 = adStack_1490[0x12] * -159545083.58041438;
  adStack_10f0[2] =
       (((((((((adStack_10f0[2] + dVar54 + dVar55 + dVar57 + dVar59 + dVar65) - dVar299) - dVar177)
            - dVar140) - dVar143) - dVar144) - dVar86) - dVar87) - dVar90) + dVar92 + dVar120 +
       dVar152 + dVar97 + dVar110 + dVar111 + dVar115 + dVar191 + dVar96 + dVar52;
  adStack_10f0[10] =
       ((dVar191 + ((dVar110 + (adStack_10f0[10] - dVar59) + dVar143 + dVar87) - dVar111)) - dVar96)
       - (dVar52 + dVar52);
  dVar55 = adStack_1490[10] * 592052.8885504483;
  adStack_10f0[0x12] = dVar52 + adStack_10f0[0x12] + dVar90;
  adStack_10f0[0xb2] =
       (((adStack_10f0[0xb2] + dVar60) - dVar82) - dVar211) + dVar262 + dVar112 + dVar157 + dVar138
       + dVar55;
  adStack_1490[2] = adStack_1490[2] * -159545083.58041438;
  local_5e0 = (local_5e0 - dVar212) + adStack_1490[2];
  local_328[1] = (((((((((local_328[1] + dVar168 + dVar126 + dVar297 + dVar29 + dVar35 + dVar215) -
                        dVar123) - dVar80) - dVar219) - dVar282) - dVar291) - dVar221) - dVar222) -
                 dVar223) + dVar224 + dVar319 + dVar292 + dVar259 + dVar205 + dVar286 + dVar206 +
                 dVar109 + dVar296 + dVar32;
  dVar109 = adStack_1490[0xe] * 26480000.0;
  adStack_10f0[0xbc] = dVar109 + adStack_10f0[0xbc];
  dVar57 = adStack_1490[0xc] * -0.0002710754168835943;
  dStack_a60 = dVar57 + dStack_a60;
  dVar54 = adStack_1490[0xb] * -0.0002710754168835943;
  local_9c0 = local_9c0 - dVar54;
  local_9b8 = dVar54 + local_9b8;
  dVar75 = adStack_1490[10] * 26480000.0;
  dVar64 = adStack_1490[0xe] * adStack_1490[10] * 0.0 +
           (0.0 - ((dStack_12a0 + local_12a8) - (dStack_1290 + dStack_12b0)) * 0.0006666666666666666
           ) * -0.0002710754168835943 * adStack_1490[0xc] * adStack_1490[0xb];
  dVar68 = adStack_1490[10] * adStack_1490[4] * 3.5866496754579007 +
           (0.001999447552130754 -
           ((local_1288 + local_12d8) - (dStack_12b0 + dStack_12e0)) * 0.0006666666666666666) *
           -4.52122891906719e-05 * adStack_1490[0xf] * adStack_1490[5];
  local_328[4] = dVar294 + (((((((((((((dVar219 + dVar219 +
                                        dVar126 + local_328[4] + dVar303 + dVar278 + dVar288 +
                                        dVar216 + dVar218 + dVar123 + dVar222) - dVar224) -
                                     (dVar225 + dVar225)) - dVar322) - dVar319) - dVar292) - dVar283
                                 ) - dVar227) - dVar268) - dVar259) - dVar304) - dVar302) - dVar269)
                           + dVar261 + dVar309 + dVar285 + dVar206 + dVar68;
  dVar69 = adStack_1490[0xe] * adStack_1490[10] * 26480000.0 +
           adStack_1490[0xc] * adStack_1490[0xb] * -0.0002710754168835943;
  dVar72 = adStack_1490[10] * adStack_1490[4] * 1793.8203338395704 +
           adStack_1490[0xf] * adStack_1490[5] * -4.52122891906719e-05;
  adStack_1490[0x1c] = adStack_1490[0x1c] + dVar293 + dVar284 + dVar240 + dVar190;
  adStack_1490[0x1b] = local_11a0 + dVar72;
  dVar52 = adStack_1490[10] * adStack_1490[0xf] * 390998.5057150522 +
           adStack_1490[0xb] * adStack_1490[0xe] * -2156.4740241498666;
  dVar59 = adStack_1490[10] * adStack_1490[0xf] * 1244.9131168262245 +
           (0.003183933182940293 -
           ((local_12a8 + dStack_1290) - (dStack_12b0 + local_1288)) * 0.0006666666666666666) *
           -2156.4740241498666 * adStack_1490[0xb] * adStack_1490[0xe];
  dVar85 = adStack_1490[0xf] * 390998.5057150522;
  adStack_10f0[0xbe] = ((adStack_10f0[0xbe] + dVar133) - dVar109) + dVar85;
  adStack_10f0[0xbf] = (dVar74 + dVar60 + adStack_10f0[0xbf] + dVar73) - dVar85;
  dVar120 = adStack_1490[0xe] * -2156.4740241498666;
  local_a50 = (local_a50 - dVar57) + dVar120;
  local_a48 = local_a48 - dVar120;
  dVar70 = adStack_1490[0xb] * -2156.4740241498666;
  local_860 = ((local_860 + dVar71) - dVar75) - dVar70;
  local_858 = dVar75 + local_858 + dVar70;
  local_838 = ((((local_838 - dVar125) - dVar78) - dVar210) - dVar161) - dVar70;
  dVar65 = adStack_1490[10] * 390998.5057150522;
  local_7b0 = (((local_7b0 - dVar298) + dVar134) - dVar91) - dVar65;
  local_7a8 = local_7a8 + dVar65;
  local_790 = local_790 + dVar248 + dVar250 + dVar251 + dVar229 + dVar65;
  dVar96 = adStack_1490[0x13] * 61950.158398051455;
  adStack_10f0[0xba] =
       ((((((dVar203 + dVar203 +
            ((dVar157 +
             dVar114 + dVar114 +
             ((dVar262 +
              (((((((adStack_10f0[0xba] - dVar60) + dVar62 + dVar133 + dVar73 + dVar82 + dVar211) -
                  dVar308) - dVar257) + dVar182) - dVar103) - dVar204)) - dVar112)) - dVar138)) -
           dVar118) - dVar74) - (dVar55 + dVar55)) - dVar109) - dVar85) - dVar96;
  adStack_10f0[0xbb] =
       dVar109 + (((dVar103 + (((adStack_10f0[0xbb] - dVar62) - dVar82) - dVar182)) - dVar114) -
                 dVar203) + dVar85 + dVar96;
  adStack_10f0[0xc2] = dVar55 + (adStack_10f0[0xc2] - dVar73) + dVar96;
  adStack_10f0[0xc3] = adStack_10f0[0xc3] - dVar96;
  dVar211 = adStack_1490[0x12] * -5603.460820379699;
  local_a70 = (((dVar142 + dVar142 +
                dVar318 + dVar318 + ((local_a70 + dVar199 + dVar202 + dVar258) - dVar121)) - dVar57)
              - dVar120) - dVar211;
  local_a68 = dVar57 + (((dVar121 + (((local_a68 - dVar199) - dVar202) - dVar258)) - dVar318) -
                       dVar142) + dVar120 + dVar211;
  local_a30 = local_a30 + dVar211;
  local_a28 = local_a28 - dVar211;
  dVar211 = adStack_1490[0xb] * -5603.460820379699;
  local_5a0 = ((local_5a0 + dVar313) - (adStack_1490[2] + adStack_1490[2])) - dVar211;
  local_598 = local_598 + dVar211;
  dVar202 = adStack_1490[10] * 61950.158398051455;
  local_558 = (((local_558 - dVar31) - dVar212) - dVar101) - dVar211;
  local_4f0 = local_4f0 - dVar202;
  local_4e8 = local_4e8 + dVar202;
  local_4b0 = local_4b0 + dVar170 + dVar253 + dVar260 + dVar202;
  local_4a8 = (((local_4a8 - dVar170) - dVar253) - dVar260) - dVar202;
  dVar121 = adStack_1490[0xe] * 6645614.320408218;
  dVar170 = adStack_1490[10] * adStack_1490[0x13] * 216.6497304178424 +
            (0.0034971618478485886 -
            ((dStack_1270 + local_12a8) - (local_1268 + dStack_12b0)) * 0.0006666666666666666) *
            -5603.460820379699 * adStack_1490[0x12] * adStack_1490[0xb];
  dVar202 = adStack_1490[4] * adStack_1490[0xe] * 594.5215787626531 +
            (8.946074058750579e-05 -
            ((dStack_12a0 + local_12c8) - (dStack_1290 + dStack_12e0)) * 0.0006666666666666666) *
            -132.4388903689313 * adStack_1490[0xc] * adStack_1490[7];
  dVar120 = adStack_1490[10] * adStack_1490[0x13] * 61950.158398051455 +
            adStack_1490[0x12] * adStack_1490[0xb] * -5603.460820379699;
  dVar118 = adStack_1490[4] * adStack_1490[0xe] * 6645614.320408218 +
            adStack_1490[0xc] * adStack_1490[7] * -132.4388903689313;
  adStack_10f0[0x38] = dVar117 + dVar116 + (adStack_10f0[0x38] - dVar135) + dVar121;
  adStack_10f0[0x3a] = (dVar108 + adStack_10f0[0x3a] + dVar323) - dVar121;
  adStack_1490[0xc] = adStack_1490[0xc] * -132.4388903689313;
  adStack_10f0[0x7a] = (adStack_10f0[0x7a] - dVar164) + adStack_1490[0xc];
  adStack_10f0[0x7c] = (adStack_10f0[0x7c] + dVar136) - adStack_1490[0xc];
  dVar85 = adStack_1490[7] * -132.4388903689313;
  local_9f0 = (((local_9f0 - dVar77) - dVar316) - dVar235) - dVar85;
  local_9d8 = (local_9d8 - dVar107) + dVar85;
  dStack_9b0 = dVar54 + dVar235 + dVar316 + ((((((dStack_9b0 + dVar131) - dVar77) + dVar314) -
                                              dVar158) + dVar159) - dVar107) + dVar58 + dVar85;
  local_9a0 = ((((local_9a0 - dVar131) - dVar314) - dVar159) - dVar54) - dVar85;
  dVar316 = adStack_1490[4] * 6645614.320408218;
  local_890 = ((local_890 - dVar78) - dVar321) - dVar316;
  local_878 = local_878 + dVar78 + dVar316;
  dStack_850 = dVar75 + dStack_850 + dVar132 + dVar84 + dVar245 + dVar316;
  local_840 = (((dVar321 +
                (((((((dVar124 + dVar312 + local_840) - dVar132) - dVar67) + dVar125 + dVar71 +
                   dVar78) - dVar84) + dVar210) - dVar245) + dVar161) - dVar75) + dVar70) - dVar316;
  local_328[9] = ((((((dVar287 + dVar287 + (local_328[9] - dVar296)) - dVar56) - dVar68) -
                   (dVar32 + dVar32)) - dVar64) - dVar59) - dVar170;
  local_328[8] = ((((dVar162 - dVar296) - dVar287) - dVar256) - dVar200) - dVar119;
  local_328[0x12] = (((local_328[0x12] - dVar218) - dVar223) - dVar269) - dVar170;
  adStack_1490[0x20] =
       ((((((dVar83 + dVar83 + (adStack_1490[0x20] - dVar89)) - dVar66) - dVar72) -
         (dVar307 + dVar307)) - dVar69) - dVar52) - dVar120;
  adStack_1490[0x1f] = ((((dVar155 - dVar89) - dVar83) - dVar172) - dVar196) - dVar63;
  dVar124 = dVar69 + dVar190 + dVar234 + ((dVar293 +
                                          ((dVar238 +
                                           ((dVar236 + (double)local_1388._8_8_) - dVar171)) -
                                          dVar228)) - dVar231) + dVar63 + dVar118;
  local_1348 = (((local_1348 - dVar176) - dVar146) - dVar240) - dVar120;
  local_1388._8_4_ = SUB84(dVar124,0);
  local_1388._0_8_ =
       dVar69 + (((((((double)local_1388._0_8_ - dVar214) - dVar220) - dVar239) + dVar25) - dVar242)
                - dVar83) + dVar52 + dVar120;
  local_1388._12_4_ = (int)((ulong)dVar124 >> 0x20);
  dStack_1370 = (((dVar241 +
                  (((((((dStack_1370 + dVar53 + dVar246) - dVar236) - dVar174) + dVar175 + dVar217 +
                     dVar23) - dVar238) + dVar145) - dVar293) + dVar284) - dVar69) + dVar52) -
                dVar118;
  local_328[10] =
       dVar64 + (((dVar310 + (((local_328[10] - dVar278) - dVar282) - dVar268)) - dVar295) - dVar287
                ) + dVar59 + dVar170;
  local_328[0xc] = (local_328[0xc] + dVar285) - dVar119;
  local_328[0xb] = dVar64 + dVar207 + dVar206 + (dVar209 - dVar285) + dVar119 + dVar202;
  local_328[0xd] =
       (((((((((((local_328[0xd] - dVar168) + dVar297 + dVar29) - dVar288) - dVar215) + dVar216 +
              dVar279 + dVar290) - dVar291) + dVar221) - dVar304) + dVar302 + dVar294) - dVar64) +
       dVar59) - dVar202;
  dVar53 = adStack_1490[0x10] * 1923289.8439964922;
  adStack_10f0[0x3b] = dVar244 + (adStack_10f0[0x3b] - dVar323) + dVar53;
  adStack_10f0[0x3c] = (dVar61 + adStack_10f0[0x3c]) - dVar53;
  dVar209 = adStack_1490[0xf] * -43.301595906050935;
  adStack_10f0[0x7d] = dVar186 + (adStack_10f0[0x7d] - dVar136) + dVar209;
  adStack_10f0[0x7e] = (dVar105 + adStack_10f0[0x7e]) - dVar209;
  dVar168 = adStack_1490[7] * -43.301595906050935;
  local_7e0 = ((local_7e0 - dVar250) - dVar91) - dVar168;
  local_7c8 = ((local_7c8 + dVar250) - dVar320) + dVar168;
  local_788 = ((dVar91 + dVar94 + dVar320 + ((dVar226 +
                                             dVar315 + (((((dVar298 + local_788) - dVar248) +
                                                         dVar134) - dVar250) - dVar251)) - dVar229))
              - dVar65) + dVar168;
  local_780 = local_780 - dVar168;
  dVar168 = adStack_1490[4] * 1923289.8439964922;
  local_730 = (local_730 - dVar76) - dVar168;
  local_718 = (local_718 - dVar326) + dVar168;
  local_6d8 = local_6d8 + dVar168;
  local_6d0 = (dVar76 + dVar326 + (local_6d0 - dVar252)) - dVar168;
  dVar125 = adStack_1490[0x12] * 228932.11193603993;
  dVar168 = adStack_1490[0x10] * adStack_1490[4] * 8226.248452056829 +
            (0.0042771756309819275 -
            ((local_12c8 + local_1288) - (dStack_12e0 + dStack_1280)) * 0.0006666666666666666) *
            -43.301595906050935 * adStack_1490[7] * adStack_1490[0xf];
  dVar124 = adStack_1490[4] * adStack_1490[0x12] * 198.4042264437053 +
            (0.0008666509244414622 -
            ((local_1278 + local_12c8) - (dStack_1270 + dStack_12e0)) * 0.0006666666666666666) *
            -5461.432196104055 * adStack_1490[0x11] * adStack_1490[7];
  adStack_10f0[0x30] =
       ((((((((dVar300 + ((((dVar311 + adStack_10f0[0x30]) - dVar135) - dVar323) - dVar281) +
                         dVar324 + dVar102) - dVar108) - dVar116) - dVar117) - dVar61) - dVar244) -
        dVar121) - dVar53) - dVar125;
  adStack_10f0[0x33] =
       (((((adStack_10f0[0x33] - dVar311) + dVar323) - dVar324) - dVar300) - dVar102) + dVar121 +
       dVar53 + dVar125;
  adStack_10f0[0x3d] = adStack_10f0[0x3d] + dVar125;
  adStack_10f0[0x3e] = adStack_10f0[0x3e] - dVar125;
  dVar53 = adStack_1490[0x11] * -5461.432196104055;
  adStack_10f0[0x72] =
       (((dVar149 + ((dVar198 + adStack_10f0[0x72]) - dVar136) + dVar139 + dVar163) -
        adStack_1490[0xc]) - dVar209) - dVar53;
  adStack_10f0[0x75] =
       (((((((((adStack_10f0[0x75] - dVar198) + dVar136) - dVar139) - dVar81) - dVar149) - dVar186)
         - dVar163) - dVar105) - dVar164) + adStack_1490[0xc] + dVar209 + dVar53;
  adStack_10f0[0x7f] = adStack_10f0[0x7f] + dVar53;
  adStack_10f0[0x80] = adStack_10f0[0x80] - dVar53;
  dVar53 = adStack_1490[7] * -5461.432196104055;
  local_680 = local_680 - dVar53;
  local_668 = local_668 + dVar53;
  local_618 = dVar33 + dVar34 + (local_618 - dVar30) + dVar53;
  local_610 = local_610 - dVar53;
  dVar53 = adStack_1490[4] * 228932.11193603993;
  local_5d0 = local_5d0 - dVar53;
  local_5b8 = local_5b8 + dVar53;
  local_568 = local_568 + dVar53;
  local_560 = (adStack_1490[2] + (local_560 - dVar313) + dVar31 + dVar212 + dVar101 + dVar211) -
              dVar53;
  local_328[0xe] =
       ((dVar68 + (((((((local_328[0xe] + dVar35) - dVar216) + dVar289) - dVar290) - dVar221) +
                    dVar319 + dVar292) - dVar302) + dVar261 + dVar119) - dVar59) + dVar168;
  dVar53 = adStack_1490[0x10] * adStack_1490[4] * 1923289.8439964922 +
           adStack_1490[7] * adStack_1490[0xf] * -43.301595906050935;
  dVar209 = adStack_1490[4] * adStack_1490[0x12] * 228932.11193603993 +
            adStack_1490[0x11] * adStack_1490[7] * -5461.432196104055;
  dStack_1368 = ((dVar72 + ((dVar267 +
                            (((((dStack_1368 + dVar266) - dVar175) + dVar237) - dVar23) - dVar145) +
                            dVar325) - dVar284) + dVar230 + dVar63) - dVar52) + dVar53;
  adStack_1490[0x1a] =
       ((((((((dVar327 + (((adStack_1490[0x1a] - dVar171) - dVar23) - dVar24) + dVar201 + dVar25) -
             dVar241) - dVar234) - dVar190) - dVar66) - dVar72) - dVar118) - dVar53) - dVar209;
  adStack_1490[0x19] =
       dVar255 + (((((((((dVar28 - dVar246) - dVar266) - dVar214) - dVar236) - dVar174) - dVar175) -
                   dVar217) - dVar237) - dVar176) + dVar171 + dVar24 + dVar66;
  adStack_1490[0x1e] =
       ((((adStack_1490[0x1e] - dVar241) - dVar232) - dVar233) - dVar242) + dVar188 + dVar189 +
       dVar213 + dVar172 + dVar196;
  adStack_1490[0x1d] = ((dVar169 - dVar22) - dVar231) + dVar118 + dVar53 + dVar209;
  local_1360 = (dVar66 + dVar22 + (local_1360 - dVar179)) - dVar53;
  dStack_1358 = dVar209 + dVar89 + (dStack_1358 - dVar217) + dVar233;
  dStack_1350 = ((dStack_1350 - dVar237) + dVar176 + dVar146 + dVar240 + dVar307 + dVar120) -
                dVar209;
  local_328[3] = ((((((((dVar322 + ((((dVar303 + local_328[3]) - dVar280) - dVar290) - dVar123) +
                                   dVar80 + dVar310) - dVar294) - dVar206) - dVar207) - dVar56) -
                   dVar68) - dVar202) - dVar168) - dVar124;
  local_328[7] = ((((local_328[7] - dVar294) - dVar205) - dVar286) - dVar295) + dVar263 + dVar264 +
                 dVar99 + dVar256 + dVar200;
  local_328[6] = ((dVar243 - dVar309) - dVar285) + dVar202 + dVar168 + dVar124;
  local_328[0xf] = ((local_328[0xf] - dVar222) + dVar309 + dVar56) - dVar168;
  local_328[0x10] = dVar124 + dVar296 + (local_328[0x10] - dVar279) + dVar286;
  local_328[0x11] =
       ((local_328[0x11] - dVar289) + dVar218 + dVar223 + dVar269 + dVar32 + dVar170) - dVar124;
  if (iVar39 == 0) {
    local_238[0] = 2.8822959451999997;
    local_238[1] = 1.4999999982659773;
    local_238[2] = 1.507252090419375;
    local_238[3] = 3.398993884662499;
    local_238[4] = 2.9627907471999997;
    local_238[5] = 4.687841430575;
    local_238[6] = 5.2821630604062495;
    local_238[7] = 4.97163097458125;
    local_238[8] = 4.98750050771875;
    local_238[9] = 7.198434206537501;
    local_238[10] = 9.874274296874997;
    local_238[0xb] = 3.2349510160250006;
    local_238[0xc] = 6.023470866475001;
    local_238[0xd] = 5.33591319330625;
    local_238[0xe] = 7.5590570047500005;
    local_238[0xf] = 9.825474777499998;
    local_238[0x10] = 12.2373674399375;
    local_238[0x11] = 14.246951215250002;
    local_238[0x12] = 16.552933378125;
    local_238[0x13] = 3.1861203930625;
    local_238[0x14] = 1.5;
    local_188[0] = 0.000507239459;
    local_188[1] = 1.4767295125000317e-13;
    local_188[2] = -1.116620304e-05;
    local_188[3] = 0.00033054475434999984;
    local_188[4] = 0.0004928155568499999;
    local_188[5] = 0.0012567384129500002;
    local_188[6] = 0.0009643321552500001;
    local_188[7] = 0.0009323347502999997;
    local_188[8] = 0.0009823763672500007;
    local_188[9] = 0.0016686828392500003;
    local_188[10] = 0.0030726129075;
    local_188[0xb] = 0.00034398350740000034;
    local_188[0xc] = 0.0006661732772499996;
    local_188[0xd] = 0.0007601921039999995;
    local_188[0xe] = 0.0015323131260000008;
    local_188[0xf] = 0.0022796327649999997;
    local_188[0x10] = 0.0027535931289999994;
    local_188[0x11] = 0.0032581048315000038;
    local_188[0x12] = 0.0039887186525;
    local_188[0x13] = 0.00037292862650000006;
    local_188[0x14] = 0.0;
    local_d8 = 1.9101473600491665;
    dVar201 = 2.079423123570834;
    dVar202 = 1.0030833333333333;
    dVar168 = 17.914627724425;
    dVar169 = 2.874817692333335;
    uVar192 = 0xcd68d3ff;
    uVar194 = 0x401c50aa;
    uVar193 = 0xb9f4c317;
    uVar195 = 0x4026ca5f;
    dVar209 = 6.7442483232375;
    dVar243 = -4.227135418966667;
    dVar172 = -6.748131844745;
    dVar196 = -27.605086887896665;
    dVar124 = 16.114317783399166;
    dVar125 = -0.5650564362916671;
    dVar52 = 34.602608086557915;
    dVar53 = 37.543891960460414;
    uVar270 = 0x8f96a67a;
    uVar271 = 0xc030862a;
    uVar272 = 0xc1acfd07;
    uVar273 = 0x40118709;
    dVar170 = 2.2555381179699996;
    dVar171 = 5.1092103122075;
    uVar274 = 0x2efd9734;
    uVar275 = 0x40327b81;
    uVar276 = 0xaf13a7dd;
    uVar277 = 0x403501f0;
    pdVar38 = local_d0;
    pdVar40 = local_c0;
    pdVar41 = local_b0;
    pdVar45 = local_a0;
    pdVar47 = local_90;
    pdVar49 = local_80;
    pdVar50 = local_70;
    pdVar51 = local_60;
    local_248 = local_258;
    local_250 = local_260;
  }
  else {
    local_238[0] = 3.8822959451999997;
    local_238[1] = 2.4999999982659773;
    local_238[2] = 2.507252090419375;
    local_238[3] = 4.398993884662499;
    local_238[4] = 3.9627907472;
    local_238[5] = 5.687841430575;
    local_238[6] = 6.28216306040625;
    local_238[7] = 5.971630974581251;
    local_238[8] = 5.98750050771875;
    local_238[9] = 8.1984342065375;
    local_238[10] = 10.874274296874997;
    local_238[0xb] = 4.234951016024999;
    local_238[0xc] = 7.023470866475001;
    local_238[0xd] = 6.33591319330625;
    local_238[0xe] = 8.55905700475;
    local_238[0xf] = 10.825474777499998;
    local_238[0x10] = 13.237367439937499;
    local_238[0x11] = 15.24695121525;
    local_238[0x12] = 17.552933378125;
    local_238[0x13] = 4.1861203930625;
    local_238[0x14] = 2.5;
    local_188[0] = 0.000507239459;
    dVar201 = 0.00037292862650000006;
    dVar202 = 0.0;
    dVar168 = 0.0032581048315000038;
    dVar169 = 0.0039887186525;
    uVar192 = 0x8585a725;
    uVar194 = 0x3f62acbc;
    uVar193 = 0xdeffcb6;
    uVar195 = 0x3f668eb4;
    dVar209 = 0.0007601921039999995;
    dVar243 = 0.0015323131260000008;
    dVar172 = 0.00034398350740000034;
    dVar196 = 0.0006661732772499996;
    dVar124 = 0.0016686828392500003;
    dVar125 = 0.0030726129075;
    dVar52 = 0.0009323347502999997;
    dVar53 = 0.0009823763672500007;
    uVar270 = 0x98871f3d;
    uVar271 = 0x3f549724;
    uVar272 = 0x88de2a4d;
    uVar273 = 0x3f4f9967;
    dVar170 = 0.00033054475434999984;
    dVar171 = 0.0004928155568499999;
    uVar274 = 0x91b4691f;
    uVar275 = 0x3d44c87a;
    uVar276 = 0x42942cb3;
    uVar277 = 0xbee76acf;
    pdVar48 = &local_12f8;
    pdVar38 = local_188 + 1;
    pdVar40 = local_188 + 3;
    pdVar41 = local_188 + 5;
    pdVar45 = local_188 + 7;
    pdVar47 = local_188 + 9;
    pdVar49 = local_188 + 0xb;
    pdVar50 = local_188 + 0xd;
    pdVar51 = local_188 + 0xf;
  }
  *(undefined4 *)pdVar38 = uVar274;
  *(undefined4 *)((long)pdVar38 + 4) = uVar275;
  *(undefined4 *)(pdVar38 + 1) = uVar276;
  *(undefined4 *)((long)pdVar38 + 0xc) = uVar277;
  *pdVar40 = dVar170;
  pdVar40[1] = dVar171;
  *(undefined4 *)pdVar41 = uVar270;
  *(undefined4 *)((long)pdVar41 + 4) = uVar271;
  *(undefined4 *)(pdVar41 + 1) = uVar272;
  *(undefined4 *)((long)pdVar41 + 0xc) = uVar273;
  *pdVar45 = dVar52;
  pdVar45[1] = dVar53;
  *pdVar47 = dVar124;
  pdVar47[1] = dVar125;
  *pdVar49 = dVar172;
  pdVar49[1] = dVar196;
  *pdVar50 = dVar209;
  pdVar50[1] = dVar243;
  *(undefined4 *)pdVar51 = uVar192;
  *(undefined4 *)((long)pdVar51 + 4) = uVar194;
  *(undefined4 *)(pdVar51 + 1) = uVar193;
  *(undefined4 *)((long)pdVar51 + 0xc) = uVar195;
  *local_248 = dVar168;
  local_248[1] = dVar169;
  *local_250 = dVar201;
  local_250[1] = dVar202;
  dVar169 = 0.0;
  dVar53 = 0.0;
  dVar168 = 0.0;
  lVar36 = 0;
  dVar52 = 0.0;
  do {
    dVar209 = *(double *)((long)adStack_1490 + lVar36 + 8U);
    dVar52 = dVar52 + *(double *)((long)local_238 + lVar36) * dVar209;
    dVar243 = *(double *)((long)pdVar48 + lVar36);
    dVar172 = *(double *)((long)adStack_1490 + lVar36 + 0xb8U);
    dVar169 = dVar169 + dVar209 * *(double *)((long)local_188 + lVar36);
    dVar53 = dVar53 + dVar172 * dVar243;
    dVar168 = dVar168 + (*(double *)((long)local_238 + lVar36) - dVar243) * 0.0006666666666666666 *
                        dVar172 + dVar243 * *(double *)((long)local_328 + lVar36);
    lVar36 = lVar36 + 8;
  } while (lVar36 != 0xa8);
  dVar53 = dVar53 * (1.0 / dVar52);
  dVar209 = (1.0 / dVar52) * 1500.0;
  dVar52 = dVar53 * dVar209;
  lVar36 = 0;
  do {
    dVar243 = 0.0;
    lVar42 = 0;
    do {
      dVar243 = dVar243 + pdVar48[lVar42] * __s[lVar42];
      lVar42 = lVar42 + 1;
    } while (lVar42 != 0x15);
    adStack_10f0[lVar36 * 0x16] = local_238[lVar36] * dVar52 + dVar243 * -dVar209;
    lVar36 = lVar36 + 1;
    __s = __s + 0x16;
  } while (lVar36 != 0x15);
  local_280 = (dVar52 * dVar169 - dVar53) - dVar209 * dVar168;
  if (local_264 == 1) {
    *rowPtrs = 1;
    if (0 < (int)local_274) {
      iVar39 = 1;
      uVar43 = 0;
      iVar46 = 1;
      do {
        lVar36 = 0;
        pdVar48 = &local_1198;
        do {
          lVar42 = -0xf20;
          iVar44 = iVar39;
          do {
            dVar52 = *(double *)((long)pdVar48 + lVar42 + 0xf20);
            if ((dVar52 != 0.0) || (NAN(dVar52))) {
              colVals[(long)iVar46 + -1] = iVar44;
              iVar46 = iVar46 + 1;
            }
            iVar44 = iVar44 + 1;
            lVar42 = lVar42 + 0xb0;
          } while (lVar42 != 0);
          rowPtrs[uVar43 * 0x16 + lVar36 + 1] = iVar46;
          lVar36 = lVar36 + 1;
          pdVar48 = pdVar48 + 1;
        } while (lVar36 != 0x16);
        uVar43 = uVar43 + 1;
        iVar39 = iVar39 + 0x16;
      } while (uVar43 != local_274);
    }
  }
  else {
    *rowPtrs = 0;
    if (0 < (int)local_274) {
      iVar39 = 0;
      uVar43 = 0;
      iVar46 = 0;
      do {
        lVar36 = 0;
        pdVar48 = &local_1198;
        do {
          lVar42 = -0xf20;
          iVar44 = iVar39;
          do {
            dVar52 = *(double *)((long)pdVar48 + lVar42 + 0xf20);
            if ((dVar52 != 0.0) || (NAN(dVar52))) {
              colVals[iVar46] = iVar44;
              iVar46 = iVar46 + 1;
            }
            iVar44 = iVar44 + 1;
            lVar42 = lVar42 + 0xb0;
          } while (lVar42 != 0);
          rowPtrs[uVar43 * 0x16 + lVar36 + 1] = iVar46;
          lVar36 = lVar36 + 1;
          pdVar48 = pdVar48 + 1;
        } while (lVar36 != 0x16);
        uVar43 = uVar43 + 1;
        iVar39 = iVar39 + 0x16;
      } while (uVar43 != local_274);
    }
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_CSR(
  int* colVals, int* rowPtrs, const int* consP, int NCELLS, int base)
{
  amrex::GpuArray<amrex::Real, 484> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 21> conc = {0.0};
  for (int n = 0; n < 21; n++) {
    conc[n] = 1.0 / 21.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtrs[0] = 1;
    int nJdata_tmp = 1;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 22;
      for (int l = 0; l < 22; l++) {
        for (int k = 0; k < 22; k++) {
          if (Jac[22 * k + l] != 0.0) {
            colVals[nJdata_tmp - 1] = k + 1 + offset;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
        rowPtrs[offset + (l + 1)] = nJdata_tmp;
      }
    }
  } else {
    rowPtrs[0] = 0;
    int nJdata_tmp = 0;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 22;
      for (int l = 0; l < 22; l++) {
        for (int k = 0; k < 22; k++) {
          if (Jac[22 * k + l] != 0.0) {
            colVals[nJdata_tmp] = k + offset;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
        rowPtrs[offset + (l + 1)] = nJdata_tmp;
      }
    }
  }
}